

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersector1<8>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  bool bVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  long lVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  long lVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar61 [16];
  undefined1 auVar76 [32];
  undefined1 auVar62 [16];
  undefined1 auVar78 [32];
  undefined1 auVar63 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar64 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  int iVar107;
  undefined4 uVar108;
  vfloat4 a0_3;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar113;
  vfloat4 a0_1;
  undefined1 auVar114 [16];
  float fVar115;
  vfloat4 a0_2;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar123;
  vfloat4 a0;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  vfloat4 b0;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  __m128 a;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar188;
  float fVar189;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  vfloat4 a0_4;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar210;
  float fVar211;
  vfloat4 b0_1;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar212;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  __m128 a_3;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  vfloat4 a0_5;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 in_ZMM18 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_32c;
  undefined1 local_328 [16];
  ulong local_310;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  long local_278;
  Primitive *local_270;
  RTCFilterFunctionNArguments local_268;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined8 uStack_b8;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar30;
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar234 [32];
  
  PVar6 = prim[1];
  uVar29 = (ulong)(byte)PVar6;
  lVar37 = uVar29 * 0x25;
  fVar215 = *(float *)(prim + lVar37 + 0x12);
  auVar88._16_16_ =
       vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                  *(undefined1 (*) [16])(prim + lVar37 + 6));
  fVar115 = fVar215 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar123 = fVar215 * auVar88._16_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar29 * 4 + 6);
  auVar71 = vpmovsxbd_avx2(auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar29 * 5 + 6);
  auVar70 = vpmovsxbd_avx2(auVar43);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar29 * 6 + 6);
  auVar80 = vpmovsxbd_avx2(auVar51);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar29 * 0xf + 6);
  auVar91 = vpmovsxbd_avx2(auVar50);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar85 = vpmovsxbd_avx2(auVar57);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar92 = vcvtdq2ps_avx(auVar85);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar29 + 6);
  auVar81 = vpmovsxbd_avx2(auVar54);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar29 * 0x1a + 6);
  auVar82 = vpmovsxbd_avx2(auVar55);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar29 * 0x1b + 6);
  auVar83 = vpmovsxbd_avx2(auVar56);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar29 * 0x1c + 6);
  auVar84 = vpmovsxbd_avx2(auVar60);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar95._4_4_ = fVar115;
  auVar95._0_4_ = fVar115;
  auVar95._8_4_ = fVar115;
  auVar95._12_4_ = fVar115;
  auVar95._16_4_ = fVar115;
  auVar95._20_4_ = fVar115;
  auVar95._24_4_ = fVar115;
  auVar95._28_4_ = fVar115;
  auVar242._8_4_ = 1;
  auVar242._0_8_ = 0x100000001;
  auVar242._12_4_ = 1;
  auVar242._16_4_ = 1;
  auVar242._20_4_ = 1;
  auVar242._24_4_ = 1;
  auVar242._28_4_ = 1;
  auVar67 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar69 = ZEXT1632(CONCAT412(fVar215 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar215 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar215 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar115))));
  auVar86 = vpermps_avx2(auVar242,auVar69);
  auVar68 = vpermps_avx512vl(auVar67,auVar69);
  fVar199 = auVar68._0_4_;
  auVar93._0_4_ = fVar199 * auVar80._0_4_;
  fVar210 = auVar68._4_4_;
  auVar93._4_4_ = fVar210 * auVar80._4_4_;
  fVar211 = auVar68._8_4_;
  auVar93._8_4_ = fVar211 * auVar80._8_4_;
  fVar212 = auVar68._12_4_;
  auVar93._12_4_ = fVar212 * auVar80._12_4_;
  fVar213 = auVar68._16_4_;
  auVar93._16_4_ = fVar213 * auVar80._16_4_;
  fVar214 = auVar68._20_4_;
  auVar93._20_4_ = fVar214 * auVar80._20_4_;
  fVar113 = auVar68._24_4_;
  auVar93._24_4_ = fVar113 * auVar80._24_4_;
  auVar93._28_4_ = 0;
  auVar69._4_4_ = auVar81._4_4_ * fVar210;
  auVar69._0_4_ = auVar81._0_4_ * fVar199;
  auVar69._8_4_ = auVar81._8_4_ * fVar211;
  auVar69._12_4_ = auVar81._12_4_ * fVar212;
  auVar69._16_4_ = auVar81._16_4_ * fVar213;
  auVar69._20_4_ = auVar81._20_4_ * fVar214;
  auVar69._24_4_ = auVar81._24_4_ * fVar113;
  auVar69._28_4_ = auVar85._28_4_;
  auVar85._4_4_ = auVar84._4_4_ * fVar210;
  auVar85._0_4_ = auVar84._0_4_ * fVar199;
  auVar85._8_4_ = auVar84._8_4_ * fVar211;
  auVar85._12_4_ = auVar84._12_4_ * fVar212;
  auVar85._16_4_ = auVar84._16_4_ * fVar213;
  auVar85._20_4_ = auVar84._20_4_ * fVar214;
  auVar85._24_4_ = auVar84._24_4_ * fVar113;
  auVar85._28_4_ = auVar68._28_4_;
  auVar42 = vfmadd231ps_fma(auVar93,auVar86,auVar70);
  auVar43 = vfmadd231ps_fma(auVar69,auVar86,auVar92);
  auVar51 = vfmadd231ps_fma(auVar85,auVar83,auVar86);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar95,auVar71);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar95,auVar91);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar82,auVar95);
  auVar233._4_4_ = fVar123;
  auVar233._0_4_ = fVar123;
  auVar233._8_4_ = fVar123;
  auVar233._12_4_ = fVar123;
  auVar233._16_4_ = fVar123;
  auVar233._20_4_ = fVar123;
  auVar233._24_4_ = fVar123;
  auVar233._28_4_ = fVar123;
  auVar86 = ZEXT1632(CONCAT412(fVar215 * auVar88._28_4_,
                               CONCAT48(fVar215 * auVar88._24_4_,
                                        CONCAT44(fVar215 * auVar88._20_4_,fVar123))));
  auVar85 = vpermps_avx2(auVar242,auVar86);
  auVar69 = vpermps_avx512vl(auVar67,auVar86);
  fVar215 = auVar69._0_4_;
  fVar199 = auVar69._4_4_;
  auVar86._4_4_ = fVar199 * auVar80._4_4_;
  auVar86._0_4_ = fVar215 * auVar80._0_4_;
  fVar210 = auVar69._8_4_;
  auVar86._8_4_ = fVar210 * auVar80._8_4_;
  fVar211 = auVar69._12_4_;
  auVar86._12_4_ = fVar211 * auVar80._12_4_;
  fVar212 = auVar69._16_4_;
  auVar86._16_4_ = fVar212 * auVar80._16_4_;
  fVar213 = auVar69._20_4_;
  auVar86._20_4_ = fVar213 * auVar80._20_4_;
  fVar214 = auVar69._24_4_;
  auVar86._24_4_ = fVar214 * auVar80._24_4_;
  auVar86._28_4_ = fVar115;
  auVar67._4_4_ = auVar81._4_4_ * fVar199;
  auVar67._0_4_ = auVar81._0_4_ * fVar215;
  auVar67._8_4_ = auVar81._8_4_ * fVar210;
  auVar67._12_4_ = auVar81._12_4_ * fVar211;
  auVar67._16_4_ = auVar81._16_4_ * fVar212;
  auVar67._20_4_ = auVar81._20_4_ * fVar213;
  auVar67._24_4_ = auVar81._24_4_ * fVar214;
  auVar67._28_4_ = auVar80._28_4_;
  auVar81._4_4_ = auVar84._4_4_ * fVar199;
  auVar81._0_4_ = auVar84._0_4_ * fVar215;
  auVar81._8_4_ = auVar84._8_4_ * fVar210;
  auVar81._12_4_ = auVar84._12_4_ * fVar211;
  auVar81._16_4_ = auVar84._16_4_ * fVar212;
  auVar81._20_4_ = auVar84._20_4_ * fVar213;
  auVar81._24_4_ = auVar84._24_4_ * fVar214;
  auVar81._28_4_ = auVar69._28_4_;
  auVar50 = vfmadd231ps_fma(auVar86,auVar85,auVar70);
  auVar57 = vfmadd231ps_fma(auVar67,auVar85,auVar92);
  auVar54 = vfmadd231ps_fma(auVar81,auVar85,auVar83);
  auVar88._16_16_ = vfmadd231ps_fma(ZEXT1632(auVar50),auVar233,auVar71);
  auVar61 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar233,auVar91);
  auVar133._8_4_ = 0x7fffffff;
  auVar133._0_8_ = 0x7fffffff7fffffff;
  auVar133._12_4_ = 0x7fffffff;
  auVar133._16_4_ = 0x7fffffff;
  auVar133._20_4_ = 0x7fffffff;
  auVar133._24_4_ = 0x7fffffff;
  auVar133._28_4_ = 0x7fffffff;
  auVar62 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar233,auVar82);
  auVar71 = vandps_avx(ZEXT1632(auVar42),auVar133);
  auVar174._8_4_ = 0x219392ef;
  auVar174._0_8_ = 0x219392ef219392ef;
  auVar174._12_4_ = 0x219392ef;
  auVar174._16_4_ = 0x219392ef;
  auVar174._20_4_ = 0x219392ef;
  auVar174._24_4_ = 0x219392ef;
  auVar174._28_4_ = 0x219392ef;
  uVar36 = vcmpps_avx512vl(auVar71,auVar174,1);
  bVar40 = (bool)((byte)uVar36 & 1);
  auVar68._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar42._0_4_;
  bVar40 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar42._4_4_;
  bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar42._8_4_;
  bVar40 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar42._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar71 = vandps_avx(ZEXT1632(auVar43),auVar133);
  uVar36 = vcmpps_avx512vl(auVar71,auVar174,1);
  bVar40 = (bool)((byte)uVar36 & 1);
  auVar87._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._0_4_;
  bVar40 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._4_4_;
  bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._8_4_;
  bVar40 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar71 = vandps_avx(ZEXT1632(auVar51),auVar133);
  uVar36 = vcmpps_avx512vl(auVar71,auVar174,1);
  bVar40 = (bool)((byte)uVar36 & 1);
  auVar71._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar51._0_4_;
  bVar40 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar51._4_4_;
  bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar51._8_4_;
  bVar40 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar51._12_4_;
  auVar71._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar71._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar71._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar71._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar70 = vrcp14ps_avx512vl(auVar68);
  auVar165._8_4_ = 0x3f800000;
  auVar165._0_8_ = 0x3f8000003f800000;
  auVar165._12_4_ = 0x3f800000;
  auVar165._16_4_ = 0x3f800000;
  auVar165._20_4_ = 0x3f800000;
  auVar165._24_4_ = 0x3f800000;
  auVar165._28_4_ = 0x3f800000;
  auVar42 = vfnmadd213ps_fma(auVar68,auVar70,auVar165);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar87);
  auVar43 = vfnmadd213ps_fma(auVar87,auVar70,auVar165);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar71);
  auVar51 = vfnmadd213ps_fma(auVar71,auVar70,auVar165);
  auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar70,auVar70);
  fVar215 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar37 + 0x16)) *
            *(float *)(prim + lVar37 + 0x1a);
  auVar143._4_4_ = fVar215;
  auVar143._0_4_ = fVar215;
  auVar143._8_4_ = fVar215;
  auVar143._12_4_ = fVar215;
  auVar143._16_4_ = fVar215;
  auVar143._20_4_ = fVar215;
  auVar143._24_4_ = fVar215;
  auVar143._28_4_ = fVar215;
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 7 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0xb + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar71);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 9 + 6));
  auVar50 = vfmadd213ps_fma(auVar70,auVar143,auVar71);
  auVar71 = vcvtdq2ps_avx(auVar80);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0xd + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar71);
  auVar57 = vfmadd213ps_fma(auVar70,auVar143,auVar71);
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x12 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar36 = (ulong)(uint)((int)(uVar29 * 5) << 2);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 2 + uVar36 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar71);
  auVar54 = vfmadd213ps_fma(auVar70,auVar143,auVar71);
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x18 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar71);
  auVar55 = vfmadd213ps_fma(auVar70,auVar143,auVar71);
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x1d + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 + (ulong)(byte)PVar6 * 0x20 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar71);
  auVar56 = vfmadd213ps_fma(auVar70,auVar143,auVar71);
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar6 * 0x20 - uVar29) + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  local_270 = prim;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x23 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar71);
  auVar60 = vfmadd213ps_fma(auVar70,auVar143,auVar71);
  auVar71 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar88._16_16_));
  auVar82._4_4_ = auVar42._4_4_ * auVar71._4_4_;
  auVar82._0_4_ = auVar42._0_4_ * auVar71._0_4_;
  auVar82._8_4_ = auVar42._8_4_ * auVar71._8_4_;
  auVar82._12_4_ = auVar42._12_4_ * auVar71._12_4_;
  auVar82._16_4_ = auVar71._16_4_ * 0.0;
  auVar82._20_4_ = auVar71._20_4_ * 0.0;
  auVar82._24_4_ = auVar71._24_4_ * 0.0;
  auVar82._28_4_ = auVar71._28_4_;
  auVar71 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar88._16_16_));
  auVar94._0_4_ = auVar42._0_4_ * auVar71._0_4_;
  auVar94._4_4_ = auVar42._4_4_ * auVar71._4_4_;
  auVar94._8_4_ = auVar42._8_4_ * auVar71._8_4_;
  auVar94._12_4_ = auVar42._12_4_ * auVar71._12_4_;
  auVar94._16_4_ = auVar71._16_4_ * 0.0;
  auVar94._20_4_ = auVar71._20_4_ * 0.0;
  auVar94._24_4_ = auVar71._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar71 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar61));
  auVar83._4_4_ = auVar43._4_4_ * auVar71._4_4_;
  auVar83._0_4_ = auVar43._0_4_ * auVar71._0_4_;
  auVar83._8_4_ = auVar43._8_4_ * auVar71._8_4_;
  auVar83._12_4_ = auVar43._12_4_ * auVar71._12_4_;
  auVar83._16_4_ = auVar71._16_4_ * 0.0;
  auVar83._20_4_ = auVar71._20_4_ * 0.0;
  auVar83._24_4_ = auVar71._24_4_ * 0.0;
  auVar83._28_4_ = auVar71._28_4_;
  auVar71 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar61));
  auVar90._0_4_ = auVar43._0_4_ * auVar71._0_4_;
  auVar90._4_4_ = auVar43._4_4_ * auVar71._4_4_;
  auVar90._8_4_ = auVar43._8_4_ * auVar71._8_4_;
  auVar90._12_4_ = auVar43._12_4_ * auVar71._12_4_;
  auVar90._16_4_ = auVar71._16_4_ * 0.0;
  auVar90._20_4_ = auVar71._20_4_ * 0.0;
  auVar90._24_4_ = auVar71._24_4_ * 0.0;
  auVar90._28_4_ = 0;
  auVar71 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar62));
  auVar84._4_4_ = auVar51._4_4_ * auVar71._4_4_;
  auVar84._0_4_ = auVar51._0_4_ * auVar71._0_4_;
  auVar84._8_4_ = auVar51._8_4_ * auVar71._8_4_;
  auVar84._12_4_ = auVar51._12_4_ * auVar71._12_4_;
  auVar84._16_4_ = auVar71._16_4_ * 0.0;
  auVar84._20_4_ = auVar71._20_4_ * 0.0;
  auVar84._24_4_ = auVar71._24_4_ * 0.0;
  auVar84._28_4_ = auVar71._28_4_;
  auVar71 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar62));
  auVar89._0_4_ = auVar51._0_4_ * auVar71._0_4_;
  auVar89._4_4_ = auVar51._4_4_ * auVar71._4_4_;
  auVar89._8_4_ = auVar51._8_4_ * auVar71._8_4_;
  auVar89._12_4_ = auVar51._12_4_ * auVar71._12_4_;
  auVar89._16_4_ = auVar71._16_4_ * 0.0;
  auVar89._20_4_ = auVar71._20_4_ * 0.0;
  auVar89._24_4_ = auVar71._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar71 = vpminsd_avx2(auVar82,auVar94);
  auVar70 = vpminsd_avx2(auVar83,auVar90);
  auVar71 = vmaxps_avx(auVar71,auVar70);
  auVar70 = vpminsd_avx2(auVar84,auVar89);
  uVar108 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar80._4_4_ = uVar108;
  auVar80._0_4_ = uVar108;
  auVar80._8_4_ = uVar108;
  auVar80._12_4_ = uVar108;
  auVar80._16_4_ = uVar108;
  auVar80._20_4_ = uVar108;
  auVar80._24_4_ = uVar108;
  auVar80._28_4_ = uVar108;
  auVar70 = vmaxps_avx512vl(auVar70,auVar80);
  auVar71 = vmaxps_avx(auVar71,auVar70);
  auVar70._8_4_ = 0x3f7ffffa;
  auVar70._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar70._12_4_ = 0x3f7ffffa;
  auVar70._16_4_ = 0x3f7ffffa;
  auVar70._20_4_ = 0x3f7ffffa;
  auVar70._24_4_ = 0x3f7ffffa;
  auVar70._28_4_ = 0x3f7ffffa;
  local_98 = vmulps_avx512vl(auVar71,auVar70);
  auVar71 = vpmaxsd_avx2(auVar82,auVar94);
  auVar70 = vpmaxsd_avx2(auVar83,auVar90);
  auVar71 = vminps_avx(auVar71,auVar70);
  auVar70 = vpmaxsd_avx2(auVar84,auVar89);
  fVar215 = (ray->super_RayK<1>).tfar;
  auVar91._4_4_ = fVar215;
  auVar91._0_4_ = fVar215;
  auVar91._8_4_ = fVar215;
  auVar91._12_4_ = fVar215;
  auVar91._16_4_ = fVar215;
  auVar91._20_4_ = fVar215;
  auVar91._24_4_ = fVar215;
  auVar91._28_4_ = fVar215;
  auVar70 = vminps_avx512vl(auVar70,auVar91);
  auVar71 = vminps_avx(auVar71,auVar70);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar92._16_4_ = 0x3f800003;
  auVar92._20_4_ = 0x3f800003;
  auVar92._24_4_ = 0x3f800003;
  auVar92._28_4_ = 0x3f800003;
  auVar71 = vmulps_avx512vl(auVar71,auVar92);
  auVar70 = vpbroadcastd_avx512vl();
  uVar15 = vpcmpgtd_avx512vl(auVar70,_DAT_01fe9900);
  uVar14 = vcmpps_avx512vl(local_98,auVar71,2);
  if ((byte)((byte)uVar14 & (byte)uVar15) != 0) {
    uVar36 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
    auVar88._16_16_ = auVar70._16_16_;
    auVar42 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
    auVar243 = ZEXT1664(auVar42);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar248 = ZEXT1664(auVar42);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar244 = ZEXT1664(auVar42);
    do {
      lVar37 = 0;
      for (uVar29 = uVar36; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar35 = *(uint *)(local_270 + 2);
      pGVar8 = (context->scene->geometries).items[uVar35].ptr;
      fVar215 = (pGVar8->time_range).lower;
      fVar215 = pGVar8->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar215) /
                ((pGVar8->time_range).upper - fVar215));
      auVar42 = vroundss_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),9);
      auVar43 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),
                               SUB6416(ZEXT464(0xbf800000),0));
      auVar42 = vminss_avx(auVar42,auVar43);
      auVar44 = vmaxss_avx512f(auVar243._0_16_,auVar42);
      local_310 = (ulong)*(uint *)(local_270 + lVar37 * 4 + 6);
      uVar29 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               (ulong)*(uint *)(local_270 + lVar37 * 4 + 6) *
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar33 = (long)(int)auVar44._0_4_ * 0x38;
      lVar10 = *(long *)(_Var9 + lVar33);
      lVar11 = *(long *)(_Var9 + 0x10 + lVar33);
      auVar42 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar29);
      lVar37 = uVar29 + 1;
      auVar43 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar37);
      lVar31 = uVar29 + 2;
      auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar31);
      lVar1 = uVar29 + 3;
      auVar50 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
      lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
      lVar11 = *(long *)(lVar10 + lVar33);
      lVar12 = *(long *)(lVar10 + 0x10 + lVar33);
      auVar57 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar29);
      auVar54 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar37);
      auVar55 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar31);
      auVar56 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
      lVar11 = *(long *)(_Var9 + 0x38 + lVar33);
      lVar12 = *(long *)(_Var9 + 0x48 + lVar33);
      auVar60 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar29);
      auVar61 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar37);
      auVar62 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar31);
      auVar63 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
      lVar11 = *(long *)(lVar10 + 0x38 + lVar33);
      lVar10 = *(long *)(lVar10 + 0x48 + lVar33);
      auVar64 = *(undefined1 (*) [16])(lVar11 + uVar29 * lVar10);
      auVar65 = *(undefined1 (*) [16])(lVar11 + lVar37 * lVar10);
      auVar66 = *(undefined1 (*) [16])(lVar11 + lVar31 * lVar10);
      auVar44 = vsubss_avx512f(ZEXT416((uint)fVar215),auVar44);
      auVar73._0_16_ = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      auVar45 = vmulps_avx512vl(auVar50,auVar73._0_16_);
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar51,auVar73._0_16_);
      auVar46 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar43,auVar45);
      auVar46 = vaddps_avx512vl(auVar42,auVar46);
      auVar135 = auVar248._0_16_;
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar43,auVar135);
      auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar42,auVar135);
      auVar47 = vmulps_avx512vl(auVar56,auVar73._0_16_);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar55,auVar73._0_16_);
      auVar116 = auVar244._0_16_;
      auVar48 = vxorps_avx512vl(auVar116,auVar116);
      auVar48 = vfmadd213ps_avx512vl(auVar48,auVar54,auVar47);
      auVar49 = vaddps_avx512vl(auVar57,auVar48);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar54,auVar135);
      auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar57,auVar135);
      auVar48 = vxorps_avx512vl(auVar48,auVar48);
      auVar48 = vfmadd213ps_avx512vl(auVar48,auVar51,auVar50);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar43,auVar73._0_16_);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar42,auVar73._0_16_);
      auVar50 = vmulps_avx512vl(auVar50,auVar135);
      auVar51 = vfnmadd231ps_avx512vl(auVar50,auVar135,auVar51);
      auVar43 = vfmadd231ps_avx512vl(auVar51,auVar73._0_16_,auVar43);
      auVar52 = vfnmadd231ps_avx512vl(auVar43,auVar73._0_16_,auVar42);
      auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar55,auVar56);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar54,auVar73._0_16_);
      auVar53 = vfmadd231ps_avx512vl(auVar42,auVar57,auVar73._0_16_);
      auVar42 = vmulps_avx512vl(auVar56,auVar135);
      auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar135,auVar55);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar73._0_16_,auVar54);
      auVar54 = vfnmadd231ps_avx512vl(auVar42,auVar73._0_16_,auVar57);
      auVar43 = vshufps_avx512vl(auVar45,auVar45,0xc9);
      auVar42 = vshufps_avx512vl(auVar49,auVar49,0xc9);
      auVar42 = vmulps_avx512vl(auVar45,auVar42);
      auVar42 = vfmsub231ps_avx512vl(auVar42,auVar43,auVar49);
      auVar51 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar42 = vmulps_avx512vl(auVar45,auVar42);
      auVar42 = vfmsub231ps_fma(auVar42,auVar43,auVar47);
      auVar50 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vshufps_avx(auVar52,auVar52,0xc9);
      auVar43 = vshufps_avx(auVar53,auVar53,0xc9);
      fVar212 = auVar52._0_4_;
      auVar146._0_4_ = fVar212 * auVar43._0_4_;
      fVar213 = auVar52._4_4_;
      auVar146._4_4_ = fVar213 * auVar43._4_4_;
      fVar214 = auVar52._8_4_;
      auVar146._8_4_ = fVar214 * auVar43._8_4_;
      fVar113 = auVar52._12_4_;
      auVar146._12_4_ = fVar113 * auVar43._12_4_;
      auVar43 = vfmsub231ps_fma(auVar146,auVar42,auVar53);
      auVar57 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar43 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar147._0_4_ = fVar212 * auVar43._0_4_;
      auVar147._4_4_ = fVar213 * auVar43._4_4_;
      auVar147._8_4_ = fVar214 * auVar43._8_4_;
      auVar147._12_4_ = fVar113 * auVar43._12_4_;
      auVar43 = vfmsub231ps_fma(auVar147,auVar42,auVar54);
      auVar42 = vdpps_avx(auVar51,auVar51,0x7f);
      auVar54 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar73._16_16_ = auVar88._16_16_;
      auVar72._4_28_ = auVar73._4_28_;
      auVar72._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar73._0_16_,auVar72._0_16_);
      auVar55 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
      auVar56 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
      auVar56 = vmulss_avx512f(auVar56,auVar43);
      auVar56 = vmulss_avx512f(auVar56,ZEXT416((uint)(auVar43._0_4_ * auVar43._0_4_)));
      auVar43 = vdpps_avx(auVar51,auVar50,0x7f);
      fVar210 = auVar55._0_4_ - auVar56._0_4_;
      fVar115 = fVar210 * auVar51._0_4_;
      fVar123 = fVar210 * auVar51._4_4_;
      fVar188 = fVar210 * auVar51._8_4_;
      fVar189 = fVar210 * auVar51._12_4_;
      auVar55 = vbroadcastss_avx512vl(auVar42);
      auVar50 = vmulps_avx512vl(auVar55,auVar50);
      fVar215 = auVar43._0_4_;
      auVar47._0_4_ = fVar215 * auVar51._0_4_;
      auVar47._4_4_ = fVar215 * auVar51._4_4_;
      auVar47._8_4_ = fVar215 * auVar51._8_4_;
      auVar47._12_4_ = fVar215 * auVar51._12_4_;
      auVar51 = vsubps_avx(auVar50,auVar47);
      auVar43 = vrcp14ss_avx512f(auVar73._0_16_,auVar72._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar43,ZEXT416(0x40000000));
      fVar215 = auVar43._0_4_ * auVar42._0_4_;
      auVar42 = vdpps_avx(auVar57,auVar57,0x7f);
      auVar75._16_16_ = auVar88._16_16_;
      auVar75._0_16_ = auVar73._0_16_;
      auVar74._4_28_ = auVar75._4_28_;
      auVar74._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar73._0_16_,auVar74._0_16_);
      auVar50 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
      auVar55 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
      fVar199 = auVar43._0_4_;
      fVar211 = auVar50._0_4_ - auVar55._0_4_ * fVar199 * fVar199 * fVar199;
      auVar43 = vdpps_avx(auVar57,auVar54,0x7f);
      auVar167._0_4_ = auVar57._0_4_ * fVar211;
      auVar167._4_4_ = auVar57._4_4_ * fVar211;
      auVar167._8_4_ = auVar57._8_4_ * fVar211;
      auVar167._12_4_ = auVar57._12_4_ * fVar211;
      auVar50 = vbroadcastss_avx512vl(auVar42);
      auVar50 = vmulps_avx512vl(auVar50,auVar54);
      fVar199 = auVar43._0_4_;
      auVar49._0_4_ = auVar57._0_4_ * fVar199;
      auVar49._4_4_ = auVar57._4_4_ * fVar199;
      auVar49._8_4_ = auVar57._8_4_ * fVar199;
      auVar49._12_4_ = auVar57._12_4_ * fVar199;
      auVar43 = vsubps_avx(auVar50,auVar49);
      auVar50 = vrcp14ss_avx512f(auVar73._0_16_,auVar74._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar50,ZEXT416(0x40000000));
      fVar199 = auVar50._0_4_ * auVar42._0_4_;
      auVar42 = vshufps_avx512vl(auVar46,auVar46,0xff);
      auVar58._0_4_ = fVar115 * auVar42._0_4_;
      auVar58._4_4_ = fVar123 * auVar42._4_4_;
      auVar58._8_4_ = fVar188 * auVar42._8_4_;
      auVar58._12_4_ = fVar189 * auVar42._12_4_;
      auVar47 = vsubps_avx512vl(auVar46,auVar58);
      auVar50 = vshufps_avx512vl(auVar45,auVar45,0xff);
      auVar53._0_4_ = fVar115 * auVar50._0_4_ + auVar42._0_4_ * fVar210 * fVar215 * auVar51._0_4_;
      auVar53._4_4_ = fVar123 * auVar50._4_4_ + auVar42._4_4_ * fVar210 * fVar215 * auVar51._4_4_;
      auVar53._8_4_ = fVar188 * auVar50._8_4_ + auVar42._8_4_ * fVar210 * fVar215 * auVar51._8_4_;
      auVar53._12_4_ =
           fVar189 * auVar50._12_4_ + auVar42._12_4_ * fVar210 * fVar215 * auVar51._12_4_;
      auVar51 = vsubps_avx512vl(auVar45,auVar53);
      auVar49 = vaddps_avx512vl(auVar46,auVar58);
      auVar50 = vaddps_avx512vl(auVar45,auVar53);
      auVar42 = vshufps_avx512vl(auVar48,auVar48,0xff);
      auVar176._0_4_ = auVar167._0_4_ * auVar42._0_4_;
      auVar176._4_4_ = auVar167._4_4_ * auVar42._4_4_;
      auVar176._8_4_ = auVar167._8_4_ * auVar42._8_4_;
      auVar176._12_4_ = auVar167._12_4_ * auVar42._12_4_;
      auVar45 = vsubps_avx512vl(auVar48,auVar176);
      auVar57 = vshufps_avx512vl(auVar52,auVar52,0xff);
      auVar57 = vmulps_avx512vl(auVar57,auVar167);
      auVar148._0_4_ = auVar57._0_4_ + auVar42._0_4_ * fVar211 * auVar43._0_4_ * fVar199;
      auVar148._4_4_ = auVar57._4_4_ + auVar42._4_4_ * fVar211 * auVar43._4_4_ * fVar199;
      auVar148._8_4_ = auVar57._8_4_ + auVar42._8_4_ * fVar211 * auVar43._8_4_ * fVar199;
      auVar148._12_4_ = auVar57._12_4_ + auVar42._12_4_ * fVar211 * auVar43._12_4_ * fVar199;
      auVar42 = vsubps_avx(auVar52,auVar148);
      auVar48 = vaddps_avx512vl(auVar48,auVar176);
      auVar149._0_4_ = fVar212 + auVar148._0_4_;
      auVar149._4_4_ = fVar213 + auVar148._4_4_;
      auVar149._8_4_ = fVar214 + auVar148._8_4_;
      auVar149._12_4_ = fVar113 + auVar148._12_4_;
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
      auVar43 = vmulps_avx512vl(auVar51,auVar52);
      auVar158._0_4_ = auVar47._0_4_ + auVar43._0_4_;
      auVar158._4_4_ = auVar47._4_4_ + auVar43._4_4_;
      auVar158._8_4_ = auVar47._8_4_ + auVar43._8_4_;
      auVar158._12_4_ = auVar47._12_4_ + auVar43._12_4_;
      auVar42 = vmulps_avx512vl(auVar42,auVar52);
      auVar55 = vsubps_avx(auVar45,auVar42);
      auVar42 = vmulps_avx512vl(auVar50,auVar52);
      auVar53 = vaddps_avx512vl(auVar49,auVar42);
      auVar43 = vmulps_avx512vl(auVar149,auVar52);
      auVar42 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar1);
      auVar56 = vsubps_avx(auVar48,auVar43);
      auVar43 = vmulps_avx512vl(auVar63,auVar73._0_16_);
      auVar51 = vfmadd231ps_avx512vl(auVar43,auVar62,auVar73._0_16_);
      auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar61,auVar51);
      auVar58 = vaddps_avx512vl(auVar60,auVar43);
      auVar43 = vfmadd231ps_avx512vl(auVar51,auVar61,auVar135);
      auVar59 = vfnmadd231ps_avx512vl(auVar43,auVar60,auVar135);
      auVar43 = vmulps_avx512vl(auVar42,auVar73._0_16_);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar66,auVar73._0_16_);
      auVar51 = vxorps_avx512vl(auVar46,auVar46);
      auVar51 = vfmadd213ps_avx512vl(auVar51,auVar65,auVar43);
      auVar50 = vaddps_avx512vl(auVar64,auVar51);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar65,auVar135);
      auVar57 = vfnmadd231ps_avx512vl(auVar43,auVar64,auVar135);
      auVar43 = vxorps_avx512vl(auVar51,auVar51);
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar62,auVar63);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar61,auVar73._0_16_);
      auVar46 = vfmadd231ps_avx512vl(auVar43,auVar60,auVar73._0_16_);
      auVar43 = vmulps_avx512vl(auVar63,auVar135);
      auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar135,auVar62);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar73._0_16_,auVar61);
      auVar60 = vfnmadd231ps_avx512vl(auVar43,auVar73._0_16_,auVar60);
      auVar43 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar66,auVar42);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar65,auVar73._0_16_);
      auVar54 = vfmadd231ps_avx512vl(auVar43,auVar64,auVar73._0_16_);
      auVar42 = vmulps_avx512vl(auVar42,auVar135);
      auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar135,auVar66);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar73._0_16_,auVar65);
      auVar61 = vfnmadd231ps_avx512vl(auVar42,auVar73._0_16_,auVar64);
      auVar42 = vshufps_avx(auVar59,auVar59,0xc9);
      auVar43 = vshufps_avx512vl(auVar50,auVar50,0xc9);
      fVar211 = auVar59._0_4_;
      auVar216._0_4_ = fVar211 * auVar43._0_4_;
      fVar212 = auVar59._4_4_;
      auVar216._4_4_ = fVar212 * auVar43._4_4_;
      fVar213 = auVar59._8_4_;
      auVar216._8_4_ = fVar213 * auVar43._8_4_;
      fVar214 = auVar59._12_4_;
      auVar216._12_4_ = fVar214 * auVar43._12_4_;
      auVar43 = vfmsub231ps_avx512vl(auVar216,auVar42,auVar50);
      auVar51 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar43 = vshufps_avx(auVar57,auVar57,0xc9);
      auVar223._0_4_ = fVar211 * auVar43._0_4_;
      auVar223._4_4_ = fVar212 * auVar43._4_4_;
      auVar223._8_4_ = fVar213 * auVar43._8_4_;
      auVar223._12_4_ = fVar214 * auVar43._12_4_;
      auVar42 = vfmsub231ps_fma(auVar223,auVar42,auVar57);
      auVar50 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar43 = vshufps_avx512vl(auVar60,auVar60,0xc9);
      auVar42 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar42 = vmulps_avx512vl(auVar60,auVar42);
      auVar42 = vfmsub231ps_fma(auVar42,auVar43,auVar54);
      auVar57 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vshufps_avx(auVar61,auVar61,0xc9);
      auVar42 = vmulps_avx512vl(auVar60,auVar42);
      auVar42 = vfmsub231ps_fma(auVar42,auVar43,auVar61);
      auVar54 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vdpps_avx(auVar51,auVar51,0x7f);
      auVar77._16_16_ = auVar88._16_16_;
      auVar77._0_16_ = auVar73._0_16_;
      auVar76._4_28_ = auVar77._4_28_;
      auVar76._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar73._0_16_,auVar76._0_16_);
      auVar61 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
      auVar62 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
      auVar62 = vmulss_avx512f(auVar62,auVar43);
      auVar43 = vmulss_avx512f(auVar62,ZEXT416((uint)(auVar43._0_4_ * auVar43._0_4_)));
      auVar43 = vsubss_avx512f(auVar61,auVar43);
      auVar235._0_4_ = auVar43._0_4_;
      auVar235._4_4_ = auVar235._0_4_;
      auVar235._8_4_ = auVar235._0_4_;
      auVar235._12_4_ = auVar235._0_4_;
      auVar43 = vdpps_avx(auVar51,auVar50,0x7f);
      auVar61 = vmulps_avx512vl(auVar51,auVar235);
      auVar62 = vbroadcastss_avx512vl(auVar42);
      auVar50 = vmulps_avx512vl(auVar62,auVar50);
      fVar215 = auVar43._0_4_;
      auVar135._0_4_ = auVar51._0_4_ * fVar215;
      auVar135._4_4_ = auVar51._4_4_ * fVar215;
      auVar135._8_4_ = auVar51._8_4_ * fVar215;
      auVar135._12_4_ = auVar51._12_4_ * fVar215;
      auVar51 = vsubps_avx(auVar50,auVar135);
      auVar43 = vrcp14ss_avx512f(auVar73._0_16_,auVar76._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar43,ZEXT416(0x40000000));
      fVar215 = auVar42._0_4_ * auVar43._0_4_;
      auVar42 = vdpps_avx(auVar57,auVar57,0x7f);
      auVar79._16_16_ = auVar88._16_16_;
      auVar79._0_16_ = auVar73._0_16_;
      auVar78._4_28_ = auVar79._4_28_;
      auVar78._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar73._0_16_,auVar78._0_16_);
      auVar50 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
      auVar88._16_16_ = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
      fVar199 = auVar43._0_4_;
      fVar210 = auVar50._0_4_ - auVar88._16_4_ * fVar199 * fVar199 * fVar199;
      auVar229._0_4_ = auVar57._0_4_ * fVar210;
      auVar229._4_4_ = auVar57._4_4_ * fVar210;
      auVar229._8_4_ = auVar57._8_4_ * fVar210;
      auVar229._12_4_ = auVar57._12_4_ * fVar210;
      auVar43 = vdpps_avx(auVar57,auVar54,0x7f);
      auVar50 = vbroadcastss_avx512vl(auVar42);
      auVar50 = vmulps_avx512vl(auVar50,auVar54);
      fVar199 = auVar43._0_4_;
      auVar190._0_4_ = auVar57._0_4_ * fVar199;
      auVar190._4_4_ = auVar57._4_4_ * fVar199;
      auVar190._8_4_ = auVar57._8_4_ * fVar199;
      auVar190._12_4_ = auVar57._12_4_ * fVar199;
      auVar43 = vsubps_avx(auVar50,auVar190);
      auVar50 = vrcp14ss_avx512f(auVar73._0_16_,auVar78._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar50,ZEXT416(0x40000000));
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar253 = ZEXT1664(auVar63);
      fVar199 = auVar50._0_4_ * auVar42._0_4_;
      auVar50 = vshufps_avx512vl(auVar58,auVar58,0xff);
      auVar57 = vmulps_avx512vl(auVar50,auVar61);
      auVar54 = vsubps_avx512vl(auVar58,auVar57);
      auVar42 = vshufps_avx(auVar59,auVar59,0xff);
      auVar42 = vmulps_avx512vl(auVar42,auVar61);
      auVar62._0_4_ = auVar42._0_4_ + auVar50._0_4_ * auVar235._0_4_ * fVar215 * auVar51._0_4_;
      auVar62._4_4_ = auVar42._4_4_ + auVar50._4_4_ * auVar235._0_4_ * fVar215 * auVar51._4_4_;
      auVar62._8_4_ = auVar42._8_4_ + auVar50._8_4_ * auVar235._0_4_ * fVar215 * auVar51._8_4_;
      auVar62._12_4_ = auVar42._12_4_ + auVar50._12_4_ * auVar235._0_4_ * fVar215 * auVar51._12_4_;
      auVar42 = vsubps_avx(auVar59,auVar62);
      auVar51 = vaddps_avx512vl(auVar58,auVar57);
      auVar64._0_4_ = fVar211 + auVar62._0_4_;
      auVar64._4_4_ = fVar212 + auVar62._4_4_;
      auVar64._8_4_ = fVar213 + auVar62._8_4_;
      auVar64._12_4_ = fVar214 + auVar62._12_4_;
      auVar50 = vshufps_avx512vl(auVar46,auVar46,0xff);
      auVar224._0_4_ = auVar50._0_4_ * auVar229._0_4_;
      auVar224._4_4_ = auVar50._4_4_ * auVar229._4_4_;
      auVar224._8_4_ = auVar50._8_4_ * auVar229._8_4_;
      auVar224._12_4_ = auVar50._12_4_ * auVar229._12_4_;
      auVar57 = vsubps_avx512vl(auVar46,auVar224);
      auVar88._16_16_ = vshufps_avx512vl(auVar60,auVar60,0xff);
      auVar88._16_16_ = vmulps_avx512vl(auVar88._16_16_,auVar229);
      auVar59._0_4_ = auVar88._16_4_ + auVar50._0_4_ * fVar210 * auVar43._0_4_ * fVar199;
      auVar59._4_4_ = auVar88._20_4_ + auVar50._4_4_ * fVar210 * auVar43._4_4_ * fVar199;
      auVar59._8_4_ = auVar88._24_4_ + auVar50._8_4_ * fVar210 * auVar43._8_4_ * fVar199;
      auVar59._12_4_ = auVar88._28_4_ + auVar50._12_4_ * fVar210 * auVar43._12_4_ * fVar199;
      auVar43 = vsubps_avx512vl(auVar60,auVar59);
      auVar50 = vaddps_avx512vl(auVar46,auVar224);
      auVar60 = vaddps_avx512vl(auVar60,auVar59);
      auVar42 = vmulps_avx512vl(auVar42,auVar52);
      auVar191._0_4_ = auVar54._0_4_ + auVar42._0_4_;
      auVar191._4_4_ = auVar54._4_4_ + auVar42._4_4_;
      auVar191._8_4_ = auVar54._8_4_ + auVar42._8_4_;
      auVar191._12_4_ = auVar54._12_4_ + auVar42._12_4_;
      auVar42 = vmulps_avx512vl(auVar43,auVar52);
      auVar42 = vsubps_avx(auVar57,auVar42);
      auVar43 = vmulps_avx512vl(auVar64,auVar52);
      auVar65._0_4_ = auVar51._0_4_ + auVar43._0_4_;
      auVar65._4_4_ = auVar51._4_4_ + auVar43._4_4_;
      auVar65._8_4_ = auVar51._8_4_ + auVar43._8_4_;
      auVar65._12_4_ = auVar51._12_4_ + auVar43._12_4_;
      auVar43 = vmulps_avx512vl(auVar60,auVar52);
      auVar252 = ZEXT464(0x3f800000);
      auVar43 = vsubps_avx(auVar50,auVar43);
      auVar60 = vbroadcastss_avx512vl(auVar44);
      auVar88._16_16_ = vsubss_avx512f(ZEXT416(0x3f800000),auVar44);
      auVar88._16_16_ = vbroadcastss_avx512vl(auVar88._16_16_);
      auVar54 = vmulps_avx512vl(auVar60,auVar54);
      auVar61 = vmulps_avx512vl(auVar60,auVar191);
      auVar42 = vmulps_avx512vl(auVar60,auVar42);
      auVar236._0_4_ = auVar60._0_4_ * auVar57._0_4_;
      auVar236._4_4_ = auVar60._4_4_ * auVar57._4_4_;
      auVar236._8_4_ = auVar60._8_4_ * auVar57._8_4_;
      auVar236._12_4_ = auVar60._12_4_ * auVar57._12_4_;
      local_1c8 = vfmadd231ps_avx512vl(auVar54,auVar88._16_16_,auVar47);
      local_1d8 = vfmadd231ps_avx512vl(auVar61,auVar88._16_16_,auVar158);
      local_1e8 = vfmadd231ps_avx512vl(auVar42,auVar88._16_16_,auVar55);
      local_1f8 = vfmadd231ps_avx512vl(auVar236,auVar88._16_16_,auVar45);
      auVar42 = vmulps_avx512vl(auVar60,auVar51);
      auVar51 = vmulps_avx512vl(auVar60,auVar65);
      auVar43 = vmulps_avx512vl(auVar60,auVar43);
      auVar225._0_4_ = auVar60._0_4_ * auVar50._0_4_;
      auVar225._4_4_ = auVar60._4_4_ * auVar50._4_4_;
      auVar225._8_4_ = auVar60._8_4_ * auVar50._8_4_;
      auVar225._12_4_ = auVar60._12_4_ * auVar50._12_4_;
      _local_208 = vfmadd231ps_avx512vl(auVar42,auVar88._16_16_,auVar49);
      _local_218 = vfmadd231ps_avx512vl(auVar51,auVar88._16_16_,auVar53);
      _local_228 = vfmadd231ps_avx512vl(auVar43,auVar88._16_16_,auVar56);
      _local_238 = vfmadd231ps_avx512vl(auVar225,auVar88._16_16_,auVar48);
      aVar3 = (ray->super_RayK<1>).org.field_0;
      auVar43 = vsubps_avx512vl(local_1c8,(undefined1  [16])aVar3);
      uVar108 = auVar43._0_4_;
      auVar44._4_4_ = uVar108;
      auVar44._0_4_ = uVar108;
      auVar44._8_4_ = uVar108;
      auVar44._12_4_ = uVar108;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      fVar215 = (pre->ray_space).vz.field_0.m128[0];
      fVar199 = (pre->ray_space).vz.field_0.m128[1];
      fVar210 = (pre->ray_space).vz.field_0.m128[2];
      fVar211 = (pre->ray_space).vz.field_0.m128[3];
      auVar66._0_4_ = fVar215 * auVar43._0_4_;
      auVar66._4_4_ = fVar199 * auVar43._4_4_;
      auVar66._8_4_ = fVar210 * auVar43._8_4_;
      auVar66._12_4_ = fVar211 * auVar43._12_4_;
      auVar42 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar5,auVar42);
      auVar57 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar44);
      auVar43 = vsubps_avx512vl(local_1d8,(undefined1  [16])aVar3);
      uVar108 = auVar43._0_4_;
      auVar46._4_4_ = uVar108;
      auVar46._0_4_ = uVar108;
      auVar46._8_4_ = uVar108;
      auVar46._12_4_ = uVar108;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar45._0_4_ = fVar215 * auVar43._0_4_;
      auVar45._4_4_ = fVar199 * auVar43._4_4_;
      auVar45._8_4_ = fVar210 * auVar43._8_4_;
      auVar45._12_4_ = fVar211 * auVar43._12_4_;
      auVar42 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar5,auVar42);
      auVar54 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar46);
      auVar43 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar3);
      uVar108 = auVar43._0_4_;
      auVar150._4_4_ = uVar108;
      auVar150._0_4_ = uVar108;
      auVar150._8_4_ = uVar108;
      auVar150._12_4_ = uVar108;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar48._0_4_ = fVar215 * auVar43._0_4_;
      auVar48._4_4_ = fVar199 * auVar43._4_4_;
      auVar48._8_4_ = fVar210 * auVar43._8_4_;
      auVar48._12_4_ = fVar211 * auVar43._12_4_;
      auVar42 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar5,auVar42);
      auVar55 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar150);
      auVar43 = vsubps_avx(local_1f8,(undefined1  [16])aVar3);
      uVar108 = auVar43._0_4_;
      auVar168._4_4_ = uVar108;
      auVar168._0_4_ = uVar108;
      auVar168._8_4_ = uVar108;
      auVar168._12_4_ = uVar108;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar151._0_4_ = fVar215 * auVar43._0_4_;
      auVar151._4_4_ = fVar199 * auVar43._4_4_;
      auVar151._8_4_ = fVar210 * auVar43._8_4_;
      auVar151._12_4_ = fVar211 * auVar43._12_4_;
      auVar42 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar5,auVar42);
      auVar56 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar168);
      auVar43 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar3);
      uVar108 = auVar43._0_4_;
      auVar177._4_4_ = uVar108;
      auVar177._0_4_ = uVar108;
      auVar177._8_4_ = uVar108;
      auVar177._12_4_ = uVar108;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar169._0_4_ = auVar43._0_4_ * fVar215;
      auVar169._4_4_ = auVar43._4_4_ * fVar199;
      auVar169._8_4_ = auVar43._8_4_ * fVar210;
      auVar169._12_4_ = auVar43._12_4_ * fVar211;
      auVar42 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar5,auVar42);
      auVar60 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar177);
      auVar43 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar3);
      uVar108 = auVar43._0_4_;
      auVar192._4_4_ = uVar108;
      auVar192._0_4_ = uVar108;
      auVar192._8_4_ = uVar108;
      auVar192._12_4_ = uVar108;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar178._0_4_ = auVar43._0_4_ * fVar215;
      auVar178._4_4_ = auVar43._4_4_ * fVar199;
      auVar178._8_4_ = auVar43._8_4_ * fVar210;
      auVar178._12_4_ = auVar43._12_4_ * fVar211;
      auVar42 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar5,auVar42);
      auVar88._16_16_ = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar192);
      auVar43 = vsubps_avx512vl(_local_228,(undefined1  [16])aVar3);
      uVar108 = auVar43._0_4_;
      auVar200._4_4_ = uVar108;
      auVar200._0_4_ = uVar108;
      auVar200._8_4_ = uVar108;
      auVar200._12_4_ = uVar108;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar193._0_4_ = auVar43._0_4_ * fVar215;
      auVar193._4_4_ = auVar43._4_4_ * fVar199;
      auVar193._8_4_ = auVar43._8_4_ * fVar210;
      auVar193._12_4_ = auVar43._12_4_ * fVar211;
      auVar42 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar5,auVar42);
      auVar61 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar200);
      auVar43 = vsubps_avx(_local_238,(undefined1  [16])aVar3);
      uVar108 = auVar43._0_4_;
      auVar201._4_4_ = uVar108;
      auVar201._0_4_ = uVar108;
      auVar201._8_4_ = uVar108;
      auVar201._12_4_ = uVar108;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar52._0_4_ = fVar215 * auVar43._0_4_;
      auVar52._4_4_ = fVar199 * auVar43._4_4_;
      auVar52._8_4_ = fVar210 * auVar43._8_4_;
      auVar52._12_4_ = fVar211 * auVar43._12_4_;
      auVar42 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar5,auVar42);
      auVar62 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar201);
      local_288 = vmovlhps_avx(auVar57,auVar60);
      local_298 = vmovlhps_avx(auVar54,auVar88._16_16_);
      local_1a8 = vmovlhps_avx512f(auVar55,auVar61);
      _local_f8 = vmovlhps_avx512f(auVar56,auVar62);
      auVar43 = vminps_avx(local_288,local_298);
      auVar42 = vmaxps_avx(local_288,local_298);
      auVar51 = vminps_avx512vl(local_1a8,_local_f8);
      auVar43 = vminps_avx(auVar43,auVar51);
      auVar51 = vmaxps_avx512vl(local_1a8,_local_f8);
      auVar42 = vmaxps_avx(auVar42,auVar51);
      auVar51 = vshufpd_avx(auVar43,auVar43,3);
      auVar50 = vshufpd_avx(auVar42,auVar42,3);
      auVar43 = vminps_avx(auVar43,auVar51);
      auVar42 = vmaxps_avx(auVar42,auVar50);
      auVar43 = vandps_avx512vl(auVar43,auVar63);
      auVar42 = vandps_avx512vl(auVar42,auVar63);
      auVar42 = vmaxps_avx(auVar43,auVar42);
      auVar43 = vmovshdup_avx(auVar42);
      auVar42 = vmaxss_avx(auVar43,auVar42);
      lVar37 = uVar36 + 0xff;
      fVar215 = auVar42._0_4_ * 9.536743e-07;
      local_1b8 = vmovddup_avx512vl(auVar57);
      auVar251 = ZEXT1664(local_1b8);
      local_2a8._8_8_ = auVar54._0_8_;
      local_2a8._0_8_ = auVar54._0_8_;
      local_2b8._8_8_ = auVar55._0_8_;
      local_2b8._0_8_ = auVar55._0_8_;
      local_2c8 = vmovddup_avx512vl(auVar56);
      register0x00001348 = auVar60._0_8_;
      local_2d8 = auVar60._0_8_;
      register0x00001388 = auVar88._16_8_;
      local_2e8 = auVar88._16_8_;
      register0x00001408 = auVar61._0_8_;
      local_2f8 = auVar61._0_8_;
      register0x00001448 = auVar62._0_8_;
      local_308 = auVar62._0_8_;
      local_e8 = ZEXT416((uint)fVar215);
      auVar63._4_4_ = fVar215;
      auVar63._0_4_ = fVar215;
      auVar63._8_4_ = fVar215;
      auVar63._12_4_ = fVar215;
      local_78._16_4_ = fVar215;
      local_78._0_16_ = auVar63;
      local_78._20_4_ = fVar215;
      local_78._24_4_ = fVar215;
      local_78._28_4_ = fVar215;
      auVar42 = vxorps_avx512vl(auVar63,auVar116);
      local_d8 = vbroadcastss_avx512vl(auVar42);
      local_328 = vsubps_avx(local_298,local_288);
      local_108 = vsubps_avx512vl(local_1a8,local_298);
      local_118 = vsubps_avx512vl(_local_f8,local_1a8);
      local_128 = vsubps_avx512vl(_local_208,local_1c8);
      local_138 = vsubps_avx512vl(_local_218,local_1d8);
      local_148 = vsubps_avx512vl(_local_228,local_1e8);
      _local_158 = vsubps_avx(_local_238,local_1f8);
      uVar29 = 0;
      auVar42 = ZEXT816(0x3f80000000000000);
      auVar61 = auVar42;
LAB_01de1172:
      auVar43 = vshufps_avx(auVar61,auVar61,0x50);
      auVar230._8_4_ = 0x3f800000;
      auVar230._0_8_ = 0x3f8000003f800000;
      auVar230._12_4_ = 0x3f800000;
      auVar234._16_4_ = 0x3f800000;
      auVar234._0_16_ = auVar230;
      auVar234._20_4_ = 0x3f800000;
      auVar234._24_4_ = 0x3f800000;
      auVar234._28_4_ = 0x3f800000;
      auVar51 = vsubps_avx(auVar230,auVar43);
      fVar215 = auVar43._0_4_;
      auVar130._0_4_ = local_2d8._0_4_ * fVar215;
      fVar199 = auVar43._4_4_;
      auVar130._4_4_ = local_2d8._4_4_ * fVar199;
      fVar210 = auVar43._8_4_;
      auVar130._8_4_ = local_2d8._8_4_ * fVar210;
      fVar211 = auVar43._12_4_;
      auVar130._12_4_ = local_2d8._12_4_ * fVar211;
      auVar136._0_4_ = local_2e8._0_4_ * fVar215;
      auVar136._4_4_ = local_2e8._4_4_ * fVar199;
      auVar136._8_4_ = local_2e8._8_4_ * fVar210;
      auVar136._12_4_ = local_2e8._12_4_ * fVar211;
      auVar152._0_4_ = local_2f8._0_4_ * fVar215;
      auVar152._4_4_ = local_2f8._4_4_ * fVar199;
      auVar152._8_4_ = local_2f8._8_4_ * fVar210;
      auVar152._12_4_ = local_2f8._12_4_ * fVar211;
      auVar116._0_4_ = local_308._0_4_ * fVar215;
      auVar116._4_4_ = local_308._4_4_ * fVar199;
      auVar116._8_4_ = local_308._8_4_ * fVar210;
      auVar116._12_4_ = local_308._12_4_ * fVar211;
      auVar54 = vfmadd231ps_avx512vl(auVar130,auVar51,auVar251._0_16_);
      auVar50 = vfmadd231ps_fma(auVar136,auVar51,local_2a8);
      auVar57 = vfmadd231ps_fma(auVar152,auVar51,local_2b8);
      auVar51 = vfmadd231ps_avx512vl(auVar116,local_2c8,auVar51);
      auVar43 = vmovshdup_avx(auVar42);
      fVar199 = auVar42._0_4_;
      fVar215 = (auVar43._0_4_ - fVar199) * 0.04761905;
      auVar175._4_4_ = fVar199;
      auVar175._0_4_ = fVar199;
      auVar175._8_4_ = fVar199;
      auVar175._12_4_ = fVar199;
      auVar175._16_4_ = fVar199;
      auVar175._20_4_ = fVar199;
      auVar175._24_4_ = fVar199;
      auVar175._28_4_ = fVar199;
      auVar128._0_8_ = auVar43._0_8_;
      auVar128._8_8_ = auVar128._0_8_;
      auVar128._16_8_ = auVar128._0_8_;
      auVar128._24_8_ = auVar128._0_8_;
      auVar71 = vsubps_avx(auVar128,auVar175);
      uVar108 = auVar54._0_4_;
      auVar129._4_4_ = uVar108;
      auVar129._0_4_ = uVar108;
      auVar129._8_4_ = uVar108;
      auVar129._12_4_ = uVar108;
      auVar129._16_4_ = uVar108;
      auVar129._20_4_ = uVar108;
      auVar129._24_4_ = uVar108;
      auVar129._28_4_ = uVar108;
      auVar196._8_4_ = 1;
      auVar196._0_8_ = 0x100000001;
      auVar196._12_4_ = 1;
      auVar196._16_4_ = 1;
      auVar196._20_4_ = 1;
      auVar196._24_4_ = 1;
      auVar196._28_4_ = 1;
      auVar91 = ZEXT1632(auVar54);
      auVar70 = vpermps_avx2(auVar196,auVar91);
      auVar80 = vbroadcastss_avx512vl(auVar50);
      auVar92 = ZEXT1632(auVar50);
      auVar81 = vpermps_avx512vl(auVar196,auVar92);
      auVar82 = vbroadcastss_avx512vl(auVar57);
      auVar89 = ZEXT1632(auVar57);
      auVar83 = vpermps_avx512vl(auVar196,auVar89);
      auVar84 = vbroadcastss_avx512vl(auVar51);
      auVar88 = ZEXT1632(auVar51);
      auVar85 = vpermps_avx512vl(auVar196,auVar88);
      auVar197._4_4_ = fVar215;
      auVar197._0_4_ = fVar215;
      auVar197._8_4_ = fVar215;
      auVar197._12_4_ = fVar215;
      auVar197._16_4_ = fVar215;
      auVar197._20_4_ = fVar215;
      auVar197._24_4_ = fVar215;
      auVar197._28_4_ = fVar215;
      auVar86 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar69 = vpermps_avx512vl(auVar86,auVar91);
      auVar166._8_4_ = 3;
      auVar166._0_8_ = 0x300000003;
      auVar166._12_4_ = 3;
      auVar166._16_4_ = 3;
      auVar166._20_4_ = 3;
      auVar166._24_4_ = 3;
      auVar166._28_4_ = 3;
      auVar67 = vpermps_avx512vl(auVar166,auVar91);
      auVar68 = vpermps_avx512vl(auVar86,auVar92);
      auVar91 = vpermps_avx2(auVar166,auVar92);
      auVar87 = vpermps_avx512vl(auVar86,auVar89);
      auVar92 = vpermps_avx2(auVar166,auVar89);
      auVar86 = vpermps_avx512vl(auVar86,auVar88);
      auVar88 = vpermps_avx512vl(auVar166,auVar88);
      auVar43 = vfmadd132ps_fma(auVar71,auVar175,_DAT_01faff20);
      auVar71 = vsubps_avx(auVar234,ZEXT1632(auVar43));
      auVar89 = vmulps_avx512vl(auVar80,ZEXT1632(auVar43));
      auVar93 = ZEXT1632(auVar43);
      auVar90 = vmulps_avx512vl(auVar81,auVar93);
      auVar51 = vfmadd231ps_fma(auVar89,auVar71,auVar129);
      auVar50 = vfmadd231ps_fma(auVar90,auVar71,auVar70);
      auVar89 = vmulps_avx512vl(auVar82,auVar93);
      auVar90 = vmulps_avx512vl(auVar83,auVar93);
      auVar80 = vfmadd231ps_avx512vl(auVar89,auVar71,auVar80);
      auVar81 = vfmadd231ps_avx512vl(auVar90,auVar71,auVar81);
      auVar89 = vmulps_avx512vl(auVar84,auVar93);
      auVar90 = ZEXT1632(auVar43);
      auVar85 = vmulps_avx512vl(auVar85,auVar90);
      auVar82 = vfmadd231ps_avx512vl(auVar89,auVar71,auVar82);
      auVar83 = vfmadd231ps_avx512vl(auVar85,auVar71,auVar83);
      fVar210 = auVar43._0_4_;
      fVar211 = auVar43._4_4_;
      auVar20._4_4_ = fVar211 * auVar80._4_4_;
      auVar20._0_4_ = fVar210 * auVar80._0_4_;
      fVar212 = auVar43._8_4_;
      auVar20._8_4_ = fVar212 * auVar80._8_4_;
      fVar213 = auVar43._12_4_;
      auVar20._12_4_ = fVar213 * auVar80._12_4_;
      auVar20._16_4_ = auVar80._16_4_ * 0.0;
      auVar20._20_4_ = auVar80._20_4_ * 0.0;
      auVar20._24_4_ = auVar80._24_4_ * 0.0;
      auVar20._28_4_ = fVar199;
      auVar21._4_4_ = fVar211 * auVar81._4_4_;
      auVar21._0_4_ = fVar210 * auVar81._0_4_;
      auVar21._8_4_ = fVar212 * auVar81._8_4_;
      auVar21._12_4_ = fVar213 * auVar81._12_4_;
      auVar21._16_4_ = auVar81._16_4_ * 0.0;
      auVar21._20_4_ = auVar81._20_4_ * 0.0;
      auVar21._24_4_ = auVar81._24_4_ * 0.0;
      auVar21._28_4_ = auVar70._28_4_;
      auVar51 = vfmadd231ps_fma(auVar20,auVar71,ZEXT1632(auVar51));
      auVar50 = vfmadd231ps_fma(auVar21,auVar71,ZEXT1632(auVar50));
      auVar121._0_4_ = fVar210 * auVar82._0_4_;
      auVar121._4_4_ = fVar211 * auVar82._4_4_;
      auVar121._8_4_ = fVar212 * auVar82._8_4_;
      auVar121._12_4_ = fVar213 * auVar82._12_4_;
      auVar121._16_4_ = auVar82._16_4_ * 0.0;
      auVar121._20_4_ = auVar82._20_4_ * 0.0;
      auVar121._24_4_ = auVar82._24_4_ * 0.0;
      auVar121._28_4_ = 0;
      auVar22._4_4_ = fVar211 * auVar83._4_4_;
      auVar22._0_4_ = fVar210 * auVar83._0_4_;
      auVar22._8_4_ = fVar212 * auVar83._8_4_;
      auVar22._12_4_ = fVar213 * auVar83._12_4_;
      auVar22._16_4_ = auVar83._16_4_ * 0.0;
      auVar22._20_4_ = auVar83._20_4_ * 0.0;
      auVar22._24_4_ = auVar83._24_4_ * 0.0;
      auVar22._28_4_ = auVar82._28_4_;
      auVar57 = vfmadd231ps_fma(auVar121,auVar71,auVar80);
      auVar54 = vfmadd231ps_fma(auVar22,auVar71,auVar81);
      auVar23._28_4_ = auVar81._28_4_;
      auVar23._0_28_ =
           ZEXT1628(CONCAT412(fVar213 * auVar54._12_4_,
                              CONCAT48(fVar212 * auVar54._8_4_,
                                       CONCAT44(fVar211 * auVar54._4_4_,fVar210 * auVar54._0_4_))));
      auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar213 * auVar57._12_4_,
                                                   CONCAT48(fVar212 * auVar57._8_4_,
                                                            CONCAT44(fVar211 * auVar57._4_4_,
                                                                     fVar210 * auVar57._0_4_)))),
                                auVar71,ZEXT1632(auVar51));
      auVar56 = vfmadd231ps_fma(auVar23,auVar71,ZEXT1632(auVar50));
      auVar70 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar51));
      auVar80 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar50));
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar70 = vmulps_avx512vl(auVar70,auVar81);
      auVar80 = vmulps_avx512vl(auVar80,auVar81);
      auVar187._0_4_ = fVar215 * auVar70._0_4_;
      auVar187._4_4_ = fVar215 * auVar70._4_4_;
      auVar187._8_4_ = fVar215 * auVar70._8_4_;
      auVar187._12_4_ = fVar215 * auVar70._12_4_;
      auVar187._16_4_ = fVar215 * auVar70._16_4_;
      auVar187._20_4_ = fVar215 * auVar70._20_4_;
      auVar187._24_4_ = fVar215 * auVar70._24_4_;
      auVar187._28_4_ = 0;
      auVar70 = vmulps_avx512vl(auVar197,auVar80);
      auVar50 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
      auVar80 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_01feed00,ZEXT1632(auVar50));
      auVar82 = vpermt2ps_avx512vl(ZEXT1632(auVar56),_DAT_01feed00,ZEXT1632(auVar50));
      auVar122._0_4_ = auVar187._0_4_ + auVar55._0_4_;
      auVar122._4_4_ = auVar187._4_4_ + auVar55._4_4_;
      auVar122._8_4_ = auVar187._8_4_ + auVar55._8_4_;
      auVar122._12_4_ = auVar187._12_4_ + auVar55._12_4_;
      auVar122._16_4_ = auVar187._16_4_ + 0.0;
      auVar122._20_4_ = auVar187._20_4_ + 0.0;
      auVar122._24_4_ = auVar187._24_4_ + 0.0;
      auVar122._28_4_ = 0;
      auVar93 = ZEXT1632(auVar50);
      auVar83 = vpermt2ps_avx512vl(auVar187,_DAT_01feed00,auVar93);
      auVar84 = vaddps_avx512vl(ZEXT1632(auVar56),auVar70);
      auVar85 = vpermt2ps_avx512vl(auVar70,_DAT_01feed00,auVar93);
      auVar70 = vsubps_avx(auVar80,auVar83);
      auVar83 = vsubps_avx512vl(auVar82,auVar85);
      auVar85 = vmulps_avx512vl(auVar68,auVar90);
      auVar89 = vmulps_avx512vl(auVar91,auVar90);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar71,auVar69);
      auVar69 = vfmadd231ps_avx512vl(auVar89,auVar71,auVar67);
      auVar67 = vmulps_avx512vl(auVar87,auVar90);
      auVar89 = vmulps_avx512vl(auVar92,auVar90);
      auVar67 = vfmadd231ps_avx512vl(auVar67,auVar71,auVar68);
      auVar91 = vfmadd231ps_avx512vl(auVar89,auVar71,auVar91);
      auVar86 = vmulps_avx512vl(auVar86,auVar90);
      auVar68 = vmulps_avx512vl(auVar88,auVar90);
      auVar51 = vfmadd231ps_fma(auVar86,auVar71,auVar87);
      auVar86 = vfmadd231ps_avx512vl(auVar68,auVar71,auVar92);
      auVar68 = vmulps_avx512vl(auVar90,auVar67);
      auVar88 = ZEXT1632(auVar43);
      auVar87 = vmulps_avx512vl(auVar88,auVar91);
      auVar85 = vfmadd231ps_avx512vl(auVar68,auVar71,auVar85);
      auVar69 = vfmadd231ps_avx512vl(auVar87,auVar71,auVar69);
      auVar86 = vmulps_avx512vl(auVar88,auVar86);
      auVar67 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar213 * auVar51._12_4_,
                                              CONCAT48(fVar212 * auVar51._8_4_,
                                                       CONCAT44(fVar211 * auVar51._4_4_,
                                                                fVar210 * auVar51._0_4_)))),auVar71,
                           auVar67);
      auVar91 = vfmadd231ps_avx512vl(auVar86,auVar71,auVar91);
      auVar24._4_4_ = fVar211 * auVar67._4_4_;
      auVar24._0_4_ = fVar210 * auVar67._0_4_;
      auVar24._8_4_ = fVar212 * auVar67._8_4_;
      auVar24._12_4_ = fVar213 * auVar67._12_4_;
      auVar24._16_4_ = auVar67._16_4_ * 0.0;
      auVar24._20_4_ = auVar67._20_4_ * 0.0;
      auVar24._24_4_ = auVar67._24_4_ * 0.0;
      auVar24._28_4_ = auVar92._28_4_;
      auVar92 = vmulps_avx512vl(auVar88,auVar91);
      auVar86 = vfmadd231ps_avx512vl(auVar24,auVar71,auVar85);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar69,auVar71);
      auVar71 = vsubps_avx512vl(auVar67,auVar85);
      auVar91 = vsubps_avx512vl(auVar91,auVar69);
      auVar71 = vmulps_avx512vl(auVar71,auVar81);
      auVar91 = vmulps_avx512vl(auVar91,auVar81);
      fVar199 = fVar215 * auVar71._0_4_;
      fVar210 = fVar215 * auVar71._4_4_;
      auVar25._4_4_ = fVar210;
      auVar25._0_4_ = fVar199;
      fVar211 = fVar215 * auVar71._8_4_;
      auVar25._8_4_ = fVar211;
      fVar212 = fVar215 * auVar71._12_4_;
      auVar25._12_4_ = fVar212;
      fVar213 = fVar215 * auVar71._16_4_;
      auVar25._16_4_ = fVar213;
      fVar214 = fVar215 * auVar71._20_4_;
      auVar25._20_4_ = fVar214;
      fVar215 = fVar215 * auVar71._24_4_;
      auVar25._24_4_ = fVar215;
      auVar25._28_4_ = auVar71._28_4_;
      auVar91 = vmulps_avx512vl(auVar197,auVar91);
      auVar81 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,auVar93);
      auVar85 = vpermt2ps_avx512vl(auVar92,_DAT_01feed00,auVar93);
      auVar198._0_4_ = auVar86._0_4_ + fVar199;
      auVar198._4_4_ = auVar86._4_4_ + fVar210;
      auVar198._8_4_ = auVar86._8_4_ + fVar211;
      auVar198._12_4_ = auVar86._12_4_ + fVar212;
      auVar198._16_4_ = auVar86._16_4_ + fVar213;
      auVar198._20_4_ = auVar86._20_4_ + fVar214;
      auVar198._24_4_ = auVar86._24_4_ + fVar215;
      auVar198._28_4_ = auVar86._28_4_ + auVar71._28_4_;
      auVar71 = vpermt2ps_avx512vl(auVar25,_DAT_01feed00,ZEXT1632(auVar50));
      auVar69 = vaddps_avx512vl(auVar92,auVar91);
      auVar91 = vpermt2ps_avx512vl(auVar91,_DAT_01feed00,ZEXT1632(auVar50));
      auVar71 = vsubps_avx(auVar81,auVar71);
      auVar91 = vsubps_avx512vl(auVar85,auVar91);
      auVar133 = ZEXT1632(auVar55);
      auVar67 = vsubps_avx512vl(auVar86,auVar133);
      auVar143 = ZEXT1632(auVar56);
      auVar68 = vsubps_avx512vl(auVar92,auVar143);
      auVar87 = vsubps_avx512vl(auVar81,auVar80);
      auVar67 = vaddps_avx512vl(auVar67,auVar87);
      auVar87 = vsubps_avx512vl(auVar85,auVar82);
      auVar68 = vaddps_avx512vl(auVar68,auVar87);
      auVar87 = vmulps_avx512vl(auVar143,auVar67);
      auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar133,auVar68);
      auVar88 = vmulps_avx512vl(auVar84,auVar67);
      auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar122,auVar68);
      auVar89 = vmulps_avx512vl(auVar83,auVar67);
      auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar70,auVar68);
      auVar90 = vmulps_avx512vl(auVar82,auVar67);
      auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar80,auVar68);
      auVar93 = vmulps_avx512vl(auVar92,auVar67);
      auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar86,auVar68);
      auVar94 = vmulps_avx512vl(auVar69,auVar67);
      auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar198,auVar68);
      auVar95 = vmulps_avx512vl(auVar91,auVar67);
      auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar71,auVar68);
      auVar67 = vmulps_avx512vl(auVar85,auVar67);
      auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar81,auVar68);
      auVar68 = vminps_avx512vl(auVar87,auVar88);
      auVar87 = vmaxps_avx512vl(auVar87,auVar88);
      auVar88 = vminps_avx512vl(auVar89,auVar90);
      auVar68 = vminps_avx512vl(auVar68,auVar88);
      auVar88 = vmaxps_avx512vl(auVar89,auVar90);
      auVar87 = vmaxps_avx512vl(auVar87,auVar88);
      auVar88 = vminps_avx512vl(auVar93,auVar94);
      auVar89 = vmaxps_avx512vl(auVar93,auVar94);
      auVar90 = vminps_avx512vl(auVar95,auVar67);
      auVar88 = vminps_avx512vl(auVar88,auVar90);
      auVar68 = vminps_avx512vl(auVar68,auVar88);
      auVar67 = vmaxps_avx512vl(auVar95,auVar67);
      auVar67 = vmaxps_avx512vl(auVar89,auVar67);
      auVar67 = vmaxps_avx512vl(auVar87,auVar67);
      uVar14 = vcmpps_avx512vl(auVar68,local_78,2);
      uVar15 = vcmpps_avx512vl(auVar67,local_d8,5);
      bVar27 = (byte)uVar14 & (byte)uVar15 & 0x7f;
      if (bVar27 == 0) {
        auVar43 = vxorps_avx512vl(auVar67._0_16_,auVar67._0_16_);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar88._16_16_ = DAT_01feed20._16_16_;
      }
      else {
        auVar67 = vsubps_avx512vl(auVar80,auVar133);
        auVar68 = vsubps_avx512vl(auVar82,auVar143);
        auVar87 = vsubps_avx512vl(auVar81,auVar86);
        auVar67 = vaddps_avx512vl(auVar67,auVar87);
        auVar87 = vsubps_avx512vl(auVar85,auVar92);
        auVar68 = vaddps_avx512vl(auVar68,auVar87);
        auVar87 = vmulps_avx512vl(auVar143,auVar67);
        auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar68,auVar133);
        auVar84 = vmulps_avx512vl(auVar84,auVar67);
        auVar84 = vfnmadd213ps_avx512vl(auVar122,auVar68,auVar84);
        auVar83 = vmulps_avx512vl(auVar83,auVar67);
        auVar83 = vfnmadd213ps_avx512vl(auVar70,auVar68,auVar83);
        auVar70 = vmulps_avx512vl(auVar82,auVar67);
        auVar82 = vfnmadd231ps_avx512vl(auVar70,auVar68,auVar80);
        auVar70 = vmulps_avx512vl(auVar92,auVar67);
        auVar92 = vfnmadd231ps_avx512vl(auVar70,auVar68,auVar86);
        auVar70 = vmulps_avx512vl(auVar69,auVar67);
        auVar86 = vfnmadd213ps_avx512vl(auVar198,auVar68,auVar70);
        auVar70 = vmulps_avx512vl(auVar91,auVar67);
        auVar69 = vfnmadd213ps_avx512vl(auVar71,auVar68,auVar70);
        auVar71 = vmulps_avx512vl(auVar85,auVar67);
        auVar81 = vfnmadd231ps_avx512vl(auVar71,auVar81,auVar68);
        auVar70 = vminps_avx(auVar87,auVar84);
        auVar71 = vmaxps_avx(auVar87,auVar84);
        auVar80 = vminps_avx(auVar83,auVar82);
        auVar80 = vminps_avx(auVar70,auVar80);
        auVar70 = vmaxps_avx(auVar83,auVar82);
        auVar71 = vmaxps_avx(auVar71,auVar70);
        auVar91 = vminps_avx(auVar92,auVar86);
        auVar70 = vmaxps_avx(auVar92,auVar86);
        auVar92 = vminps_avx(auVar69,auVar81);
        auVar91 = vminps_avx(auVar91,auVar92);
        auVar91 = vminps_avx(auVar80,auVar91);
        auVar80 = vmaxps_avx(auVar69,auVar81);
        auVar70 = vmaxps_avx(auVar70,auVar80);
        auVar71 = vmaxps_avx(auVar71,auVar70);
        uVar14 = vcmpps_avx512vl(auVar71,local_d8,5);
        uVar15 = vcmpps_avx512vl(auVar91,local_78,2);
        bVar27 = bVar27 & (byte)uVar14 & (byte)uVar15;
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        if (bVar27 != 0) {
          auStack_198[uVar29] = (uint)bVar27;
          uVar14 = vmovlps_avx(auVar42);
          (&uStack_b8)[uVar29] = uVar14;
          uVar2 = vmovlps_avx(auVar61);
          auStack_58[uVar29] = uVar2;
          uVar29 = (ulong)((int)uVar29 + 1);
        }
        auVar43 = vxorps_avx512vl(auVar67._0_16_,auVar67._0_16_);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar88._16_16_ = auVar71._16_16_;
      }
      auVar249 = ZEXT3264(_DAT_01feed20);
      auVar248 = ZEXT1664(auVar42);
      in_ZMM23 = ZEXT464(0x3e2aaaab);
      auVar247 = ZEXT1664(auVar51);
      auVar246 = ZEXT1664(auVar50);
      auVar245 = ZEXT3264(auVar71);
      auVar244 = ZEXT1664(auVar57);
      auVar243 = ZEXT1664(auVar43);
      auVar250 = ZEXT1664(local_328);
      if ((int)uVar29 != 0) {
        do {
          auVar43 = auVar243._0_16_;
          auVar51 = auVar248._0_16_;
          uVar28 = (int)uVar29 - 1;
          uVar30 = (ulong)uVar28;
          uVar7 = auStack_198[uVar30];
          auVar61._8_8_ = 0;
          auVar61._0_8_ = auStack_58[uVar30];
          uVar2 = 0;
          for (uVar34 = (ulong)uVar7; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
          {
            uVar2 = uVar2 + 1;
          }
          uVar32 = uVar7 - 1 & uVar7;
          bVar40 = uVar32 == 0;
          auStack_198[uVar30] = uVar32;
          if (bVar40) {
            uVar29 = (ulong)uVar28;
          }
          auVar109._8_8_ = 0;
          auVar109._0_8_ = uVar2;
          auVar42 = vpunpcklqdq_avx(auVar109,ZEXT416((int)uVar2 + 1));
          auVar42 = vcvtqq2ps_avx512vl(auVar42);
          auVar42 = vmulps_avx512vl(auVar42,auVar246._0_16_);
          uVar108 = *(undefined4 *)((long)&uStack_b8 + uVar30 * 8 + 4);
          auVar16._4_4_ = uVar108;
          auVar16._0_4_ = uVar108;
          auVar16._8_4_ = uVar108;
          auVar16._12_4_ = uVar108;
          auVar50 = vmulps_avx512vl(auVar42,auVar16);
          auVar57 = auVar247._0_16_;
          auVar42 = vsubps_avx512vl(auVar57,auVar42);
          uVar108 = *(undefined4 *)(&uStack_b8 + uVar30);
          auVar17._4_4_ = uVar108;
          auVar17._0_4_ = uVar108;
          auVar17._8_4_ = uVar108;
          auVar17._12_4_ = uVar108;
          auVar42 = vfmadd231ps_avx512vl(auVar50,auVar42,auVar17);
          auVar50 = vmovshdup_avx(auVar42);
          fVar215 = auVar50._0_4_ - auVar42._0_4_;
          auVar50 = vucomiss_avx512f(ZEXT416((uint)fVar215));
          in_ZMM23 = ZEXT1664(auVar50);
          if (uVar7 == 0 || bVar40) goto LAB_01de1172;
          auVar50 = vshufps_avx(auVar61,auVar61,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar215));
          auVar55 = vsubps_avx512vl(auVar57,auVar50);
          fVar199 = auVar50._0_4_;
          auVar137._0_4_ = fVar199 * (float)local_2d8._0_4_;
          fVar210 = auVar50._4_4_;
          auVar137._4_4_ = fVar210 * (float)local_2d8._4_4_;
          fVar211 = auVar50._8_4_;
          auVar137._8_4_ = fVar211 * fStack_2d0;
          fVar212 = auVar50._12_4_;
          auVar137._12_4_ = fVar212 * fStack_2cc;
          auVar153._0_4_ = fVar199 * (float)local_2e8._0_4_;
          auVar153._4_4_ = fVar210 * (float)local_2e8._4_4_;
          auVar153._8_4_ = fVar211 * fStack_2e0;
          auVar153._12_4_ = fVar212 * fStack_2dc;
          auVar159._0_4_ = fVar199 * (float)local_2f8._0_4_;
          auVar159._4_4_ = fVar210 * (float)local_2f8._4_4_;
          auVar159._8_4_ = fVar211 * fStack_2f0;
          auVar159._12_4_ = fVar212 * fStack_2ec;
          auVar124._0_4_ = fVar199 * (float)local_308._0_4_;
          auVar124._4_4_ = fVar210 * (float)local_308._4_4_;
          auVar124._8_4_ = fVar211 * fStack_300;
          auVar124._12_4_ = fVar212 * fStack_2fc;
          auVar56 = vfmadd231ps_avx512vl(auVar137,auVar55,auVar251._0_16_);
          auVar50 = vfmadd231ps_fma(auVar153,auVar55,local_2a8);
          auVar54 = vfmadd231ps_fma(auVar159,auVar55,local_2b8);
          auVar55 = vfmadd231ps_fma(auVar124,auVar55,local_2c8);
          auVar134._16_16_ = auVar56;
          auVar134._0_16_ = auVar56;
          auVar144._16_16_ = auVar50;
          auVar144._0_16_ = auVar50;
          auVar157._16_16_ = auVar54;
          auVar157._0_16_ = auVar54;
          auVar70 = vpermps_avx512vl(auVar249._0_32_,ZEXT1632(auVar42));
          auVar71 = vsubps_avx(auVar144,auVar134);
          auVar56 = vfmadd213ps_fma(auVar71,auVar70,auVar134);
          auVar71 = vsubps_avx(auVar157,auVar144);
          auVar60 = vfmadd213ps_fma(auVar71,auVar70,auVar144);
          auVar50 = vsubps_avx(auVar55,auVar54);
          auVar145._16_16_ = auVar50;
          auVar145._0_16_ = auVar50;
          auVar50 = vfmadd213ps_fma(auVar145,auVar70,auVar157);
          auVar71 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar56));
          auVar54 = vfmadd213ps_fma(auVar71,auVar70,ZEXT1632(auVar56));
          auVar71 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar60));
          auVar50 = vfmadd213ps_fma(auVar71,auVar70,ZEXT1632(auVar60));
          auVar71 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar54));
          auVar45 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar71,auVar70);
          auVar71 = vmulps_avx512vl(auVar71,auVar245._0_32_);
          auVar88._16_16_ = auVar71._16_16_;
          fVar199 = fVar215 * 0.33333334;
          auVar160._0_8_ =
               CONCAT44(auVar45._4_4_ + fVar199 * auVar71._4_4_,
                        auVar45._0_4_ + fVar199 * auVar71._0_4_);
          auVar160._8_4_ = auVar45._8_4_ + fVar199 * auVar71._8_4_;
          auVar160._12_4_ = auVar45._12_4_ + fVar199 * auVar71._12_4_;
          auVar138._0_4_ = fVar199 * auVar71._16_4_;
          auVar138._4_4_ = fVar199 * auVar71._20_4_;
          auVar138._8_4_ = fVar199 * auVar71._24_4_;
          auVar138._12_4_ = fVar199 * auVar71._28_4_;
          auVar65 = vsubps_avx((undefined1  [16])0x0,auVar138);
          auVar60 = vshufpd_avx(auVar45,auVar45,3);
          auVar62 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar50 = vsubps_avx(auVar60,auVar45);
          auVar54 = vsubps_avx(auVar62,(undefined1  [16])0x0);
          auVar179._0_4_ = auVar50._0_4_ + auVar54._0_4_;
          auVar179._4_4_ = auVar50._4_4_ + auVar54._4_4_;
          auVar179._8_4_ = auVar50._8_4_ + auVar54._8_4_;
          auVar179._12_4_ = auVar50._12_4_ + auVar54._12_4_;
          auVar50 = vshufps_avx(auVar45,auVar45,0xb1);
          auVar54 = vshufps_avx(auVar160,auVar160,0xb1);
          auVar55 = vshufps_avx(auVar65,auVar65,0xb1);
          auVar56 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar231._4_4_ = auVar179._0_4_;
          auVar231._0_4_ = auVar179._0_4_;
          auVar231._8_4_ = auVar179._0_4_;
          auVar231._12_4_ = auVar179._0_4_;
          auVar63 = vshufps_avx(auVar179,auVar179,0x55);
          fVar199 = auVar63._0_4_;
          auVar194._0_4_ = auVar50._0_4_ * fVar199;
          fVar210 = auVar63._4_4_;
          auVar194._4_4_ = auVar50._4_4_ * fVar210;
          fVar211 = auVar63._8_4_;
          auVar194._8_4_ = auVar50._8_4_ * fVar211;
          fVar212 = auVar63._12_4_;
          auVar194._12_4_ = auVar50._12_4_ * fVar212;
          auVar202._0_4_ = auVar54._0_4_ * fVar199;
          auVar202._4_4_ = auVar54._4_4_ * fVar210;
          auVar202._8_4_ = auVar54._8_4_ * fVar211;
          auVar202._12_4_ = auVar54._12_4_ * fVar212;
          auVar217._0_4_ = auVar55._0_4_ * fVar199;
          auVar217._4_4_ = auVar55._4_4_ * fVar210;
          auVar217._8_4_ = auVar55._8_4_ * fVar211;
          auVar217._12_4_ = auVar55._12_4_ * fVar212;
          auVar180._0_4_ = auVar56._0_4_ * fVar199;
          auVar180._4_4_ = auVar56._4_4_ * fVar210;
          auVar180._8_4_ = auVar56._8_4_ * fVar211;
          auVar180._12_4_ = auVar56._12_4_ * fVar212;
          auVar50 = vfmadd231ps_fma(auVar194,auVar231,auVar45);
          auVar54 = vfmadd231ps_fma(auVar202,auVar231,auVar160);
          auVar66 = vfmadd231ps_fma(auVar217,auVar231,auVar65);
          auVar44 = vfmadd231ps_fma(auVar180,(undefined1  [16])0x0,auVar231);
          auVar63 = vshufpd_avx(auVar50,auVar50,1);
          auVar64 = vshufpd_avx(auVar54,auVar54,1);
          auVar46 = vshufpd_avx512vl(auVar66,auVar66,1);
          auVar47 = vshufpd_avx512vl(auVar44,auVar44,1);
          auVar55 = vminss_avx(auVar50,auVar54);
          auVar50 = vmaxss_avx(auVar54,auVar50);
          auVar56 = vminss_avx(auVar66,auVar44);
          auVar54 = vmaxss_avx(auVar44,auVar66);
          auVar55 = vminss_avx(auVar55,auVar56);
          auVar50 = vmaxss_avx(auVar54,auVar50);
          auVar56 = vminss_avx(auVar63,auVar64);
          auVar54 = vmaxss_avx(auVar64,auVar63);
          auVar63 = vminss_avx512f(auVar46,auVar47);
          auVar64 = vmaxss_avx512f(auVar47,auVar46);
          auVar54 = vmaxss_avx(auVar64,auVar54);
          auVar56 = vminss_avx512f(auVar56,auVar63);
          fVar210 = auVar54._0_4_;
          fVar199 = auVar50._0_4_;
          if (0.0001 <= auVar55._0_4_) {
LAB_01de18ea:
            vucomiss_avx512f(auVar56);
            bVar41 = fVar210 <= -0.0001;
            bVar39 = -0.0001 < fVar199;
            bVar38 = bVar41;
            if (!bVar41) goto LAB_01de1940;
            uVar14 = vcmpps_avx512vl(auVar55,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar15 = vcmpps_avx512vl(auVar56,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar28 = (uint)uVar14 & (uint)uVar15;
            bVar26 = (uVar28 & 1) == 0;
            bVar41 = bVar39 && bVar26;
            bVar38 = bVar39 && (uVar28 & 1) == 0;
            if (bVar39 && bVar26) goto LAB_01de1940;
          }
          else {
            bVar41 = fVar210 == -0.0001;
            bVar38 = NAN(fVar210);
            if (fVar210 <= -0.0001) goto LAB_01de18ea;
LAB_01de1940:
            vcmpss_avx512f(auVar55,auVar43,1);
            auVar66 = auVar252._0_16_;
            uVar14 = vcmpss_avx512f(auVar50,auVar43,1);
            bVar39 = (bool)((byte)uVar14 & 1);
            auVar88._0_16_ = auVar66;
            iVar107 = auVar252._0_4_;
            auVar96._4_28_ = auVar88._4_28_;
            auVar96._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * iVar107);
            vucomiss_avx512f(auVar96._0_16_);
            bVar38 = (bool)(!bVar41 | bVar38);
            bVar39 = bVar38 == false;
            auVar98._16_16_ = auVar88._16_16_;
            auVar98._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar97._4_28_ = auVar98._4_28_;
            auVar97._0_4_ = (uint)bVar38 * auVar243._0_4_ + (uint)!bVar38 * 0x7f800000;
            auVar64 = auVar97._0_16_;
            auVar100._16_16_ = auVar88._16_16_;
            auVar100._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar99._4_28_ = auVar100._4_28_;
            auVar99._0_4_ = (uint)bVar38 * auVar243._0_4_ + (uint)!bVar38 * -0x800000;
            auVar63 = auVar99._0_16_;
            uVar14 = vcmpss_avx512f(auVar56,auVar43,1);
            bVar41 = (bool)((byte)uVar14 & 1);
            auVar102._16_16_ = auVar88._16_16_;
            auVar102._0_16_ = auVar66;
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * iVar107);
            vucomiss_avx512f(auVar101._0_16_);
            if ((bVar38) || (bVar39)) {
              auVar56 = vucomiss_avx512f(auVar55);
              if ((bVar38) || (bVar39)) {
                auVar44 = vxorps_avx512vl(auVar55,auVar244._0_16_);
                auVar55 = vsubss_avx512f(auVar56,auVar55);
                auVar55 = vdivss_avx512f(auVar44,auVar55);
                auVar56 = vsubss_avx512f(auVar66,auVar55);
                auVar56 = vfmadd213ss_avx512f(auVar56,auVar43,auVar55);
                auVar55 = auVar56;
              }
              else {
                auVar56 = vxorps_avx512vl(auVar56,auVar56);
                vucomiss_avx512f(auVar56);
                if ((bVar38) || (auVar55 = auVar66, bVar39)) {
                  auVar56 = ZEXT416(0x7f800000);
                  auVar55 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar64 = vminss_avx512f(auVar64,auVar56);
              auVar63 = vmaxss_avx(auVar55,auVar63);
            }
            uVar14 = vcmpss_avx512f(auVar54,auVar43,1);
            bVar41 = (bool)((byte)uVar14 & 1);
            fVar211 = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * iVar107);
            if ((auVar96._0_4_ != fVar211) || (NAN(auVar96._0_4_) || NAN(fVar211))) {
              if ((fVar210 != fVar199) || (NAN(fVar210) || NAN(fVar199))) {
                auVar50 = vxorps_avx512vl(auVar50,auVar244._0_16_);
                auVar181._0_4_ = auVar50._0_4_ / (fVar210 - fVar199);
                auVar181._4_12_ = auVar50._4_12_;
                auVar50 = vsubss_avx512f(auVar66,auVar181);
                auVar50 = vfmadd213ss_avx512f(auVar50,auVar43,auVar181);
                auVar54 = auVar50;
              }
              else if ((fVar199 != 0.0) ||
                      (auVar50 = auVar66, auVar54 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar199))) {
                auVar50 = SUB6416(ZEXT464(0xff800000),0);
                auVar54 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar64 = vminss_avx(auVar64,auVar54);
              auVar63 = vmaxss_avx(auVar50,auVar63);
            }
            bVar41 = auVar101._0_4_ != fVar211;
            auVar50 = vminss_avx512f(auVar64,auVar66);
            auVar104._16_16_ = auVar88._16_16_;
            auVar104._0_16_ = auVar64;
            auVar103._4_28_ = auVar104._4_28_;
            auVar103._0_4_ = (uint)bVar41 * auVar50._0_4_ + (uint)!bVar41 * auVar64._0_4_;
            auVar50 = vmaxss_avx512f(auVar66,auVar63);
            auVar106._16_16_ = auVar88._16_16_;
            auVar106._0_16_ = auVar63;
            auVar105._4_28_ = auVar106._4_28_;
            auVar105._0_4_ = (uint)bVar41 * auVar50._0_4_ + (uint)!bVar41 * auVar63._0_4_;
            auVar50 = vmaxss_avx512f(auVar43,auVar103._0_16_);
            auVar54 = vminss_avx512f(auVar105._0_16_,auVar66);
            if (auVar50._0_4_ <= auVar54._0_4_) {
              auVar56 = vmaxss_avx512f(auVar43,ZEXT416((uint)(auVar50._0_4_ + -0.1)));
              auVar44 = vminss_avx512f(ZEXT416((uint)(auVar54._0_4_ + 0.1)),auVar66);
              auVar125._0_8_ = auVar45._0_8_;
              auVar125._8_8_ = auVar125._0_8_;
              auVar203._8_8_ = auVar160._0_8_;
              auVar203._0_8_ = auVar160._0_8_;
              auVar218._8_8_ = auVar65._0_8_;
              auVar218._0_8_ = auVar65._0_8_;
              auVar50 = vshufpd_avx(auVar160,auVar160,3);
              auVar54 = vshufpd_avx(auVar65,auVar65,3);
              auVar55 = vshufps_avx(auVar56,auVar44,0);
              auVar64 = vsubps_avx512vl(auVar57,auVar55);
              fVar199 = auVar55._0_4_;
              auVar154._0_4_ = fVar199 * auVar60._0_4_;
              fVar210 = auVar55._4_4_;
              auVar154._4_4_ = fVar210 * auVar60._4_4_;
              fVar211 = auVar55._8_4_;
              auVar154._8_4_ = fVar211 * auVar60._8_4_;
              fVar212 = auVar55._12_4_;
              auVar154._12_4_ = fVar212 * auVar60._12_4_;
              auVar161._0_4_ = fVar199 * auVar50._0_4_;
              auVar161._4_4_ = fVar210 * auVar50._4_4_;
              auVar161._8_4_ = fVar211 * auVar50._8_4_;
              auVar161._12_4_ = fVar212 * auVar50._12_4_;
              auVar237._0_4_ = auVar54._0_4_ * fVar199;
              auVar237._4_4_ = auVar54._4_4_ * fVar210;
              auVar237._8_4_ = auVar54._8_4_ * fVar211;
              auVar237._12_4_ = auVar54._12_4_ * fVar212;
              auVar139._0_4_ = fVar199 * auVar62._0_4_;
              auVar139._4_4_ = fVar210 * auVar62._4_4_;
              auVar139._8_4_ = fVar211 * auVar62._8_4_;
              auVar139._12_4_ = fVar212 * auVar62._12_4_;
              auVar60 = vfmadd231ps_fma(auVar154,auVar64,auVar125);
              auVar62 = vfmadd231ps_fma(auVar161,auVar64,auVar203);
              auVar63 = vfmadd231ps_fma(auVar237,auVar64,auVar218);
              auVar64 = vfmadd231ps_fma(auVar139,auVar64,ZEXT816(0));
              auVar54 = vsubss_avx512f(auVar66,auVar56);
              auVar50 = vmovshdup_avx(auVar61);
              auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar56._0_4_)),auVar61,
                                        auVar54);
              auVar54 = vsubss_avx512f(auVar66,auVar44);
              auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar44._0_4_)),auVar61,
                                        auVar54);
              auVar61 = vdivss_avx512f(auVar66,ZEXT416((uint)fVar215));
              auVar50 = vsubps_avx(auVar62,auVar60);
              auVar55 = vmulps_avx512vl(auVar50,auVar51);
              auVar50 = vsubps_avx(auVar63,auVar62);
              auVar56 = vmulps_avx512vl(auVar50,auVar51);
              auVar50 = vsubps_avx(auVar64,auVar63);
              auVar50 = vmulps_avx512vl(auVar50,auVar51);
              auVar54 = vminps_avx(auVar56,auVar50);
              auVar50 = vmaxps_avx(auVar56,auVar50);
              auVar54 = vminps_avx(auVar55,auVar54);
              auVar50 = vmaxps_avx(auVar55,auVar50);
              auVar55 = vshufpd_avx(auVar54,auVar54,3);
              auVar56 = vshufpd_avx(auVar50,auVar50,3);
              auVar54 = vminps_avx(auVar54,auVar55);
              auVar50 = vmaxps_avx(auVar50,auVar56);
              fVar215 = auVar61._0_4_;
              auVar182._0_4_ = auVar54._0_4_ * fVar215;
              auVar182._4_4_ = auVar54._4_4_ * fVar215;
              auVar182._8_4_ = auVar54._8_4_ * fVar215;
              auVar182._12_4_ = auVar54._12_4_ * fVar215;
              auVar170._0_4_ = fVar215 * auVar50._0_4_;
              auVar170._4_4_ = fVar215 * auVar50._4_4_;
              auVar170._8_4_ = fVar215 * auVar50._8_4_;
              auVar170._12_4_ = fVar215 * auVar50._12_4_;
              auVar65 = vdivss_avx512f(auVar66,ZEXT416((uint)(auVar46._0_4_ - auVar45._0_4_)));
              auVar50 = vshufpd_avx(auVar60,auVar60,3);
              auVar54 = vshufpd_avx(auVar62,auVar62,3);
              auVar55 = vshufpd_avx(auVar63,auVar63,3);
              auVar56 = vshufpd_avx(auVar64,auVar64,3);
              auVar50 = vsubps_avx(auVar50,auVar60);
              auVar60 = vsubps_avx(auVar54,auVar62);
              auVar61 = vsubps_avx(auVar55,auVar63);
              auVar56 = vsubps_avx(auVar56,auVar64);
              auVar54 = vminps_avx(auVar50,auVar60);
              auVar50 = vmaxps_avx(auVar50,auVar60);
              auVar55 = vminps_avx(auVar61,auVar56);
              auVar55 = vminps_avx(auVar54,auVar55);
              auVar54 = vmaxps_avx(auVar61,auVar56);
              auVar50 = vmaxps_avx(auVar50,auVar54);
              fVar215 = auVar65._0_4_;
              auVar219._0_4_ = fVar215 * auVar55._0_4_;
              auVar219._4_4_ = fVar215 * auVar55._4_4_;
              auVar219._8_4_ = fVar215 * auVar55._8_4_;
              auVar219._12_4_ = fVar215 * auVar55._12_4_;
              auVar204._0_4_ = fVar215 * auVar50._0_4_;
              auVar204._4_4_ = fVar215 * auVar50._4_4_;
              auVar204._8_4_ = fVar215 * auVar50._8_4_;
              auVar204._12_4_ = fVar215 * auVar50._12_4_;
              auVar56 = vinsertps_avx(auVar42,auVar45,0x10);
              auVar47 = vpermt2ps_avx512vl(auVar42,_DAT_01feecd0,auVar46);
              auVar114._0_4_ = auVar56._0_4_ + auVar47._0_4_;
              auVar114._4_4_ = auVar56._4_4_ + auVar47._4_4_;
              auVar114._8_4_ = auVar56._8_4_ + auVar47._8_4_;
              auVar114._12_4_ = auVar56._12_4_ + auVar47._12_4_;
              auVar18._8_4_ = 0x3f000000;
              auVar18._0_8_ = 0x3f0000003f000000;
              auVar18._12_4_ = 0x3f000000;
              auVar64 = vmulps_avx512vl(auVar114,auVar18);
              auVar54 = vshufps_avx(auVar64,auVar64,0x54);
              uVar108 = auVar64._0_4_;
              auVar117._4_4_ = uVar108;
              auVar117._0_4_ = uVar108;
              auVar117._8_4_ = uVar108;
              auVar117._12_4_ = uVar108;
              auVar60 = vfmadd213ps_avx512vl(auVar250._0_16_,auVar117,local_288);
              auVar61 = vfmadd213ps_avx512vl(local_108,auVar117,local_298);
              auVar55 = vfmadd213ps_fma(local_118,auVar117,local_1a8);
              auVar50 = vsubps_avx(auVar61,auVar60);
              auVar60 = vfmadd213ps_fma(auVar50,auVar117,auVar60);
              auVar50 = vsubps_avx(auVar55,auVar61);
              auVar50 = vfmadd213ps_fma(auVar50,auVar117,auVar61);
              auVar50 = vsubps_avx(auVar50,auVar60);
              auVar55 = vfmadd231ps_fma(auVar60,auVar50,auVar117);
              auVar62 = vmulps_avx512vl(auVar50,auVar51);
              auVar226._8_8_ = auVar55._0_8_;
              auVar226._0_8_ = auVar55._0_8_;
              auVar50 = vshufpd_avx(auVar55,auVar55,3);
              auVar55 = vshufps_avx(auVar64,auVar64,0x55);
              auVar60 = vsubps_avx(auVar50,auVar226);
              auVar61 = vfmadd231ps_fma(auVar226,auVar55,auVar60);
              auVar238._8_8_ = auVar62._0_8_;
              auVar238._0_8_ = auVar62._0_8_;
              auVar50 = vshufpd_avx(auVar62,auVar62,3);
              auVar50 = vsubps_avx512vl(auVar50,auVar238);
              auVar50 = vfmadd213ps_avx512vl(auVar50,auVar55,auVar238);
              auVar118._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
              auVar118._8_4_ = auVar60._8_4_ ^ 0x80000000;
              auVar118._12_4_ = auVar60._12_4_ ^ 0x80000000;
              auVar55 = vmovshdup_avx512vl(auVar50);
              auVar239._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
              auVar239._8_4_ = auVar55._8_4_ ^ 0x80000000;
              auVar239._12_4_ = auVar55._12_4_ ^ 0x80000000;
              auVar62 = vmovshdup_avx512vl(auVar60);
              auVar63 = vpermt2ps_avx512vl(auVar239,ZEXT416(5),auVar60);
              auVar55 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar60._0_4_)),auVar50,
                                            auVar62);
              auVar60 = vpermt2ps_avx512vl(auVar50,SUB6416(ZEXT464(4),0),auVar118);
              auVar140._0_4_ = auVar55._0_4_;
              auVar140._4_4_ = auVar140._0_4_;
              auVar140._8_4_ = auVar140._0_4_;
              auVar140._12_4_ = auVar140._0_4_;
              auVar50 = vdivps_avx(auVar63,auVar140);
              auVar48 = vdivps_avx512vl(auVar60,auVar140);
              fVar215 = auVar61._0_4_;
              auVar55 = vshufps_avx(auVar61,auVar61,0x55);
              auVar227._0_4_ = fVar215 * auVar50._0_4_ + auVar55._0_4_ * auVar48._0_4_;
              auVar227._4_4_ = fVar215 * auVar50._4_4_ + auVar55._4_4_ * auVar48._4_4_;
              auVar227._8_4_ = fVar215 * auVar50._8_4_ + auVar55._8_4_ * auVar48._8_4_;
              auVar227._12_4_ = fVar215 * auVar50._12_4_ + auVar55._12_4_ * auVar48._12_4_;
              auVar65 = vsubps_avx(auVar54,auVar227);
              auVar55 = vmovshdup_avx(auVar50);
              auVar54 = vinsertps_avx(auVar182,auVar219,0x1c);
              auVar240._0_4_ = auVar55._0_4_ * auVar54._0_4_;
              auVar240._4_4_ = auVar55._4_4_ * auVar54._4_4_;
              auVar240._8_4_ = auVar55._8_4_ * auVar54._8_4_;
              auVar240._12_4_ = auVar55._12_4_ * auVar54._12_4_;
              auVar44 = vinsertps_avx512f(auVar170,auVar204,0x1c);
              auVar55 = vmulps_avx512vl(auVar55,auVar44);
              auVar63 = vminps_avx512vl(auVar240,auVar55);
              auVar61 = vmaxps_avx(auVar55,auVar240);
              auVar62 = vmovshdup_avx(auVar48);
              auVar55 = vinsertps_avx(auVar219,auVar182,0x4c);
              auVar220._0_4_ = auVar62._0_4_ * auVar55._0_4_;
              auVar220._4_4_ = auVar62._4_4_ * auVar55._4_4_;
              auVar220._8_4_ = auVar62._8_4_ * auVar55._8_4_;
              auVar220._12_4_ = auVar62._12_4_ * auVar55._12_4_;
              auVar60 = vinsertps_avx(auVar204,auVar170,0x4c);
              auVar205._0_4_ = auVar62._0_4_ * auVar60._0_4_;
              auVar205._4_4_ = auVar62._4_4_ * auVar60._4_4_;
              auVar205._8_4_ = auVar62._8_4_ * auVar60._8_4_;
              auVar205._12_4_ = auVar62._12_4_ * auVar60._12_4_;
              auVar62 = vminps_avx(auVar220,auVar205);
              auVar63 = vaddps_avx512vl(auVar63,auVar62);
              auVar62 = vmaxps_avx(auVar205,auVar220);
              auVar206._0_4_ = auVar61._0_4_ + auVar62._0_4_;
              auVar206._4_4_ = auVar61._4_4_ + auVar62._4_4_;
              auVar206._8_4_ = auVar61._8_4_ + auVar62._8_4_;
              auVar206._12_4_ = auVar61._12_4_ + auVar62._12_4_;
              auVar221._8_8_ = 0x3f80000000000000;
              auVar221._0_8_ = 0x3f80000000000000;
              auVar61 = vsubps_avx(auVar221,auVar206);
              auVar62 = vsubps_avx(auVar221,auVar63);
              auVar63 = vsubps_avx(auVar56,auVar64);
              auVar64 = vsubps_avx(auVar47,auVar64);
              fVar212 = auVar63._0_4_;
              auVar241._0_4_ = fVar212 * auVar61._0_4_;
              fVar213 = auVar63._4_4_;
              auVar241._4_4_ = fVar213 * auVar61._4_4_;
              fVar214 = auVar63._8_4_;
              auVar241._8_4_ = fVar214 * auVar61._8_4_;
              fVar113 = auVar63._12_4_;
              auVar241._12_4_ = fVar113 * auVar61._12_4_;
              auVar49 = vbroadcastss_avx512vl(auVar50);
              auVar54 = vmulps_avx512vl(auVar49,auVar54);
              auVar44 = vmulps_avx512vl(auVar49,auVar44);
              auVar49 = vminps_avx512vl(auVar54,auVar44);
              auVar44 = vmaxps_avx512vl(auVar44,auVar54);
              auVar54 = vbroadcastss_avx512vl(auVar48);
              auVar55 = vmulps_avx512vl(auVar54,auVar55);
              auVar54 = vmulps_avx512vl(auVar54,auVar60);
              auVar60 = vminps_avx512vl(auVar55,auVar54);
              auVar60 = vaddps_avx512vl(auVar49,auVar60);
              auVar63 = vmulps_avx512vl(auVar63,auVar62);
              fVar215 = auVar64._0_4_;
              auVar207._0_4_ = fVar215 * auVar61._0_4_;
              fVar199 = auVar64._4_4_;
              auVar207._4_4_ = fVar199 * auVar61._4_4_;
              fVar210 = auVar64._8_4_;
              auVar207._8_4_ = fVar210 * auVar61._8_4_;
              fVar211 = auVar64._12_4_;
              auVar207._12_4_ = fVar211 * auVar61._12_4_;
              auVar222._0_4_ = fVar215 * auVar62._0_4_;
              auVar222._4_4_ = fVar199 * auVar62._4_4_;
              auVar222._8_4_ = fVar210 * auVar62._8_4_;
              auVar222._12_4_ = fVar211 * auVar62._12_4_;
              auVar54 = vmaxps_avx(auVar54,auVar55);
              auVar171._0_4_ = auVar44._0_4_ + auVar54._0_4_;
              auVar171._4_4_ = auVar44._4_4_ + auVar54._4_4_;
              auVar171._8_4_ = auVar44._8_4_ + auVar54._8_4_;
              auVar171._12_4_ = auVar44._12_4_ + auVar54._12_4_;
              auVar183._8_8_ = 0x3f800000;
              auVar183._0_8_ = 0x3f800000;
              auVar54 = vsubps_avx(auVar183,auVar171);
              auVar55 = vsubps_avx512vl(auVar183,auVar60);
              auVar232._0_4_ = fVar212 * auVar54._0_4_;
              auVar232._4_4_ = fVar213 * auVar54._4_4_;
              auVar232._8_4_ = fVar214 * auVar54._8_4_;
              auVar232._12_4_ = fVar113 * auVar54._12_4_;
              auVar228._0_4_ = fVar212 * auVar55._0_4_;
              auVar228._4_4_ = fVar213 * auVar55._4_4_;
              auVar228._8_4_ = fVar214 * auVar55._8_4_;
              auVar228._12_4_ = fVar113 * auVar55._12_4_;
              auVar172._0_4_ = fVar215 * auVar54._0_4_;
              auVar172._4_4_ = fVar199 * auVar54._4_4_;
              auVar172._8_4_ = fVar210 * auVar54._8_4_;
              auVar172._12_4_ = fVar211 * auVar54._12_4_;
              auVar184._0_4_ = fVar215 * auVar55._0_4_;
              auVar184._4_4_ = fVar199 * auVar55._4_4_;
              auVar184._8_4_ = fVar210 * auVar55._8_4_;
              auVar184._12_4_ = fVar211 * auVar55._12_4_;
              auVar54 = vminps_avx(auVar232,auVar228);
              auVar55 = vminps_avx512vl(auVar172,auVar184);
              auVar60 = vminps_avx512vl(auVar54,auVar55);
              auVar54 = vmaxps_avx(auVar228,auVar232);
              auVar55 = vmaxps_avx(auVar184,auVar172);
              auVar55 = vmaxps_avx(auVar55,auVar54);
              auVar61 = vminps_avx512vl(auVar241,auVar63);
              auVar54 = vminps_avx(auVar207,auVar222);
              auVar54 = vminps_avx(auVar61,auVar54);
              auVar54 = vhaddps_avx(auVar60,auVar54);
              auVar61 = vmaxps_avx512vl(auVar63,auVar241);
              auVar60 = vmaxps_avx(auVar222,auVar207);
              auVar60 = vmaxps_avx(auVar60,auVar61);
              auVar55 = vhaddps_avx(auVar55,auVar60);
              auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
              auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
              auVar173._0_4_ = auVar54._0_4_ + auVar65._0_4_;
              auVar173._4_4_ = auVar54._4_4_ + auVar65._4_4_;
              auVar173._8_4_ = auVar54._8_4_ + auVar65._8_4_;
              auVar173._12_4_ = auVar54._12_4_ + auVar65._12_4_;
              auVar185._0_4_ = auVar55._0_4_ + auVar65._0_4_;
              auVar185._4_4_ = auVar55._4_4_ + auVar65._4_4_;
              auVar185._8_4_ = auVar55._8_4_ + auVar65._8_4_;
              auVar185._12_4_ = auVar55._12_4_ + auVar65._12_4_;
              auVar54 = vmaxps_avx(auVar56,auVar173);
              auVar55 = vminps_avx(auVar185,auVar47);
              uVar2 = vcmpps_avx512vl(auVar55,auVar54,1);
              if ((uVar2 & 3) == 0) {
                uVar2 = vcmpps_avx512vl(auVar185,auVar47,1);
                uVar14 = vcmpps_avx512vl(auVar42,auVar173,1);
                if (((ushort)uVar14 & (ushort)uVar2 & 1) == 0) {
                  bVar27 = 0;
                }
                else {
                  auVar54 = vmovshdup_avx(auVar173);
                  bVar27 = auVar45._0_4_ < auVar54._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar29 || uVar7 != 0 && !bVar40) | bVar27) != 1) {
                  auVar61 = vinsertps_avx(auVar45,auVar46,0x10);
                  auVar251 = ZEXT1664(local_1b8);
                  goto LAB_01de1172;
                }
                lVar31 = 200;
                do {
                  auVar42 = vsubss_avx512f(auVar66,auVar65);
                  fVar210 = auVar42._0_4_;
                  fVar215 = fVar210 * fVar210 * fVar210;
                  auVar42 = vmulss_avx512f(auVar65,ZEXT416(0x40400000));
                  fVar199 = auVar42._0_4_ * fVar210 * fVar210;
                  fVar211 = auVar65._0_4_;
                  auVar42 = vmulss_avx512f(ZEXT416((uint)(fVar211 * fVar211)),ZEXT416(0x40400000));
                  fVar210 = fVar210 * auVar42._0_4_;
                  auVar131._4_4_ = fVar215;
                  auVar131._0_4_ = fVar215;
                  auVar131._8_4_ = fVar215;
                  auVar131._12_4_ = fVar215;
                  auVar126._4_4_ = fVar199;
                  auVar126._0_4_ = fVar199;
                  auVar126._8_4_ = fVar199;
                  auVar126._12_4_ = fVar199;
                  auVar110._4_4_ = fVar210;
                  auVar110._0_4_ = fVar210;
                  auVar110._8_4_ = fVar210;
                  auVar110._12_4_ = fVar210;
                  fVar211 = fVar211 * fVar211 * fVar211;
                  auVar155._0_4_ = (float)local_f8._0_4_ * fVar211;
                  auVar155._4_4_ = (float)local_f8._4_4_ * fVar211;
                  auVar155._8_4_ = fStack_f0 * fVar211;
                  auVar155._12_4_ = fStack_ec * fVar211;
                  auVar42 = vfmadd231ps_fma(auVar155,local_1a8,auVar110);
                  auVar42 = vfmadd231ps_fma(auVar42,local_298,auVar126);
                  auVar42 = vfmadd231ps_fma(auVar42,local_288,auVar131);
                  auVar111._8_8_ = auVar42._0_8_;
                  auVar111._0_8_ = auVar42._0_8_;
                  auVar42 = vshufpd_avx(auVar42,auVar42,3);
                  auVar54 = vshufps_avx(auVar65,auVar65,0x55);
                  auVar42 = vsubps_avx(auVar42,auVar111);
                  auVar54 = vfmadd213ps_fma(auVar42,auVar54,auVar111);
                  fVar215 = auVar54._0_4_;
                  auVar42 = vshufps_avx(auVar54,auVar54,0x55);
                  auVar112._0_4_ = auVar50._0_4_ * fVar215 + auVar48._0_4_ * auVar42._0_4_;
                  auVar112._4_4_ = auVar50._4_4_ * fVar215 + auVar48._4_4_ * auVar42._4_4_;
                  auVar112._8_4_ = auVar50._8_4_ * fVar215 + auVar48._8_4_ * auVar42._8_4_;
                  auVar112._12_4_ = auVar50._12_4_ * fVar215 + auVar48._12_4_ * auVar42._12_4_;
                  auVar65 = vsubps_avx(auVar65,auVar112);
                  auVar42 = vandps_avx512vl(auVar54,auVar253._0_16_);
                  auVar54 = vprolq_avx512vl(auVar42,0x20);
                  auVar42 = vmaxss_avx(auVar54,auVar42);
                  bVar40 = auVar42._0_4_ <= (float)local_e8._0_4_;
                  if (auVar42._0_4_ < (float)local_e8._0_4_) {
                    auVar42 = vucomiss_avx512f(auVar43);
                    if (bVar40) {
                      auVar50 = vucomiss_avx512f(auVar42);
                      auVar252 = ZEXT1664(auVar50);
                      if (bVar40) {
                        vmovshdup_avx(auVar42);
                        auVar50 = vucomiss_avx512f(auVar43);
                        if (bVar40) {
                          auVar54 = vucomiss_avx512f(auVar50);
                          auVar252 = ZEXT1664(auVar54);
                          if (bVar40) {
                            auVar55 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128
                                                                  [2]),
                                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128
                                                                  [2]),0x1c);
                            auVar65 = vinsertps_avx(auVar55,ZEXT416((uint)(pre->ray_space).vz.
                                                                          field_0.m128[2]),0x28);
                            aVar3 = (ray->super_RayK<1>).org.field_0;
                            auVar55 = vsubps_avx(local_1c8,(undefined1  [16])aVar3);
                            auVar55 = vdpps_avx(auVar55,auVar65,0x7f);
                            auVar56 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
                            auVar56 = vdpps_avx(auVar56,auVar65,0x7f);
                            auVar60 = vsubps_avx(local_1e8,(undefined1  [16])aVar3);
                            auVar60 = vdpps_avx(auVar60,auVar65,0x7f);
                            auVar61 = vsubps_avx(local_1f8,(undefined1  [16])aVar3);
                            auVar61 = vdpps_avx(auVar61,auVar65,0x7f);
                            auVar62 = vsubps_avx(_local_208,(undefined1  [16])aVar3);
                            auVar62 = vdpps_avx(auVar62,auVar65,0x7f);
                            auVar63 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
                            auVar63 = vdpps_avx(auVar63,auVar65,0x7f);
                            auVar64 = vsubps_avx(_local_228,(undefined1  [16])aVar3);
                            auVar64 = vdpps_avx(auVar64,auVar65,0x7f);
                            auVar66 = vsubps_avx(_local_238,(undefined1  [16])aVar3);
                            auVar65 = vdpps_avx(auVar66,auVar65,0x7f);
                            auVar66 = vsubss_avx512f(auVar54,auVar50);
                            fVar215 = auVar50._0_4_;
                            auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar215)),
                                                      auVar66,auVar55);
                            auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * fVar215)),
                                                      auVar66,auVar56);
                            auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * fVar215)),
                                                      auVar66,auVar60);
                            auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar65._0_4_)),
                                                      auVar66,auVar61);
                            auVar54 = vsubss_avx512f(auVar54,auVar42);
                            auVar156._0_4_ = auVar54._0_4_;
                            fVar199 = auVar156._0_4_ * auVar156._0_4_ * auVar156._0_4_;
                            auVar54 = vmulss_avx512f(auVar42,ZEXT416(0x40400000));
                            fVar210 = auVar54._0_4_ * auVar156._0_4_ * auVar156._0_4_;
                            fVar215 = auVar42._0_4_;
                            auVar141._0_4_ = fVar215 * fVar215;
                            auVar141._4_4_ = auVar42._4_4_ * auVar42._4_4_;
                            auVar141._8_4_ = auVar42._8_4_ * auVar42._8_4_;
                            auVar141._12_4_ = auVar42._12_4_ * auVar42._12_4_;
                            auVar54 = vmulss_avx512f(auVar141,ZEXT416(0x40400000));
                            fVar211 = auVar156._0_4_ * auVar54._0_4_;
                            fVar213 = fVar215 * auVar141._0_4_;
                            auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar60._0_4_)),
                                                      ZEXT416((uint)fVar211),auVar56);
                            auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar210),auVar55);
                            auVar50 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar199),auVar50);
                            fVar212 = auVar50._0_4_;
                            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar212) &&
                               (fVar214 = (ray->super_RayK<1>).tfar, fVar212 <= fVar214)) {
                              auVar50 = vshufps_avx(auVar42,auVar42,0x55);
                              auVar55 = vsubps_avx512vl(auVar57,auVar50);
                              fVar113 = auVar50._0_4_;
                              auVar186._0_4_ = fVar113 * (float)local_208._0_4_;
                              fVar115 = auVar50._4_4_;
                              auVar186._4_4_ = fVar115 * (float)local_208._4_4_;
                              fVar123 = auVar50._8_4_;
                              auVar186._8_4_ = fVar123 * fStack_200;
                              fVar188 = auVar50._12_4_;
                              auVar186._12_4_ = fVar188 * fStack_1fc;
                              auVar195._0_4_ = fVar113 * (float)local_218._0_4_;
                              auVar195._4_4_ = fVar115 * (float)local_218._4_4_;
                              auVar195._8_4_ = fVar123 * fStack_210;
                              auVar195._12_4_ = fVar188 * fStack_20c;
                              auVar208._0_4_ = fVar113 * (float)local_228._0_4_;
                              auVar208._4_4_ = fVar115 * (float)local_228._4_4_;
                              auVar208._8_4_ = fVar123 * fStack_220;
                              auVar208._12_4_ = fVar188 * fStack_21c;
                              auVar162._0_4_ = fVar113 * (float)local_238._0_4_;
                              auVar162._4_4_ = fVar115 * (float)local_238._4_4_;
                              auVar162._8_4_ = fVar123 * fStack_230;
                              auVar162._12_4_ = fVar188 * fStack_22c;
                              auVar50 = vfmadd231ps_fma(auVar186,auVar55,local_1c8);
                              auVar57 = vfmadd231ps_fma(auVar195,auVar55,local_1d8);
                              auVar54 = vfmadd231ps_fma(auVar208,auVar55,local_1e8);
                              auVar55 = vfmadd231ps_fma(auVar162,auVar55,local_1f8);
                              auVar50 = vsubps_avx(auVar57,auVar50);
                              auVar57 = vsubps_avx(auVar54,auVar57);
                              auVar54 = vsubps_avx(auVar55,auVar54);
                              auVar209._0_4_ = fVar215 * auVar57._0_4_;
                              auVar209._4_4_ = fVar215 * auVar57._4_4_;
                              auVar209._8_4_ = fVar215 * auVar57._8_4_;
                              auVar209._12_4_ = fVar215 * auVar57._12_4_;
                              auVar156._4_4_ = auVar156._0_4_;
                              auVar156._8_4_ = auVar156._0_4_;
                              auVar156._12_4_ = auVar156._0_4_;
                              auVar50 = vfmadd231ps_fma(auVar209,auVar156,auVar50);
                              auVar163._0_4_ = fVar215 * auVar54._0_4_;
                              auVar163._4_4_ = fVar215 * auVar54._4_4_;
                              auVar163._8_4_ = fVar215 * auVar54._8_4_;
                              auVar163._12_4_ = fVar215 * auVar54._12_4_;
                              auVar57 = vfmadd231ps_fma(auVar163,auVar156,auVar57);
                              auVar164._0_4_ = fVar215 * auVar57._0_4_;
                              auVar164._4_4_ = fVar215 * auVar57._4_4_;
                              auVar164._8_4_ = fVar215 * auVar57._8_4_;
                              auVar164._12_4_ = fVar215 * auVar57._12_4_;
                              auVar50 = vfmadd231ps_fma(auVar164,auVar156,auVar50);
                              auVar51 = vmulps_avx512vl(auVar50,auVar51);
                              pGVar8 = (context->scene->geometries).items[uVar35].ptr;
                              if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
                                auVar142._0_4_ = fVar213 * (float)local_158._0_4_;
                                auVar142._4_4_ = fVar213 * (float)local_158._4_4_;
                                auVar142._8_4_ = fVar213 * fStack_150;
                                auVar142._12_4_ = fVar213 * fStack_14c;
                                auVar132._4_4_ = fVar211;
                                auVar132._0_4_ = fVar211;
                                auVar132._8_4_ = fVar211;
                                auVar132._12_4_ = fVar211;
                                auVar50 = vfmadd132ps_fma(auVar132,auVar142,local_148);
                                auVar127._4_4_ = fVar210;
                                auVar127._0_4_ = fVar210;
                                auVar127._8_4_ = fVar210;
                                auVar127._12_4_ = fVar210;
                                auVar50 = vfmadd132ps_fma(auVar127,auVar50,local_138);
                                auVar119._4_4_ = fVar199;
                                auVar119._0_4_ = fVar199;
                                auVar119._8_4_ = fVar199;
                                auVar119._12_4_ = fVar199;
                                auVar54 = vfmadd132ps_fma(auVar119,auVar50,local_128);
                                auVar50 = vshufps_avx(auVar54,auVar54,0xc9);
                                auVar57 = vshufps_avx(auVar51,auVar51,0xc9);
                                auVar120._0_4_ = auVar54._0_4_ * auVar57._0_4_;
                                auVar120._4_4_ = auVar54._4_4_ * auVar57._4_4_;
                                auVar120._8_4_ = auVar54._8_4_ * auVar57._8_4_;
                                auVar120._12_4_ = auVar54._12_4_ * auVar57._12_4_;
                                auVar51 = vfmsub231ps_fma(auVar120,auVar51,auVar50);
                                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                  (ray->super_RayK<1>).tfar = fVar212;
                                  auVar43 = vshufps_avx(auVar51,auVar51,0xe9);
                                  uVar14 = vmovlps_avx(auVar43);
                                  *(undefined8 *)&(ray->Ng).field_0 = uVar14;
                                  (ray->Ng).field_0.field_0.z = auVar51._0_4_;
                                  uVar14 = vmovlps_avx(auVar42);
                                  ray->u = (float)(int)uVar14;
                                  ray->v = (float)(int)((ulong)uVar14 >> 0x20);
                                  ray->primID = (uint)local_310;
                                  ray->geomID = uVar35;
                                  ray->instID[0] = context->user->instID[0];
                                  ray->instPrimID[0] = context->user->instPrimID[0];
                                }
                                else {
                                  auVar50 = vshufps_avx(auVar51,auVar51,0xe9);
                                  local_188 = vmovlps_avx(auVar50);
                                  local_180 = auVar51._0_4_;
                                  local_17c = vmovlps_avx(auVar42);
                                  local_174 = (uint)local_310;
                                  local_170 = uVar35;
                                  local_16c = context->user->instID[0];
                                  local_168 = context->user->instPrimID[0];
                                  (ray->super_RayK<1>).tfar = fVar212;
                                  local_32c = -1;
                                  local_268.valid = &local_32c;
                                  local_268.geometryUserPtr = pGVar8->userPtr;
                                  local_268.context = context->user;
                                  local_268.ray = (RTCRayN *)ray;
                                  local_268.hit = (RTCHitN *)&local_188;
                                  local_268.N = 1;
                                  if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01de240f:
                                    auVar42 = auVar243._0_16_;
                                    p_Var13 = context->args->filter;
                                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var13)(&local_268);
                                      auVar249 = ZEXT3264(_DAT_01feed20);
                                      in_ZMM23 = ZEXT464(0x3e2aaaab);
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar247 = ZEXT1664(auVar43);
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                      auVar246 = ZEXT1664(auVar43);
                                      auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      auVar245 = ZEXT3264(auVar71);
                                      auVar88._16_16_ = auVar71._16_16_;
                                      auVar250 = ZEXT1664(local_328);
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar244 = ZEXT1664(auVar43);
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar253 = ZEXT1664(auVar43);
                                      auVar252 = ZEXT464(0x3f800000);
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      auVar248 = ZEXT1664(auVar43);
                                      auVar42 = vxorps_avx512vl(auVar42,auVar42);
                                      auVar243 = ZEXT1664(auVar42);
                                      if (*local_268.valid == 0) goto LAB_01de252a;
                                    }
                                    (((Vec3f *)((long)local_268.ray + 0x30))->field_0).components[0]
                                         = *(float *)local_268.hit;
                                    (((Vec3f *)((long)local_268.ray + 0x30))->field_0).field_0.y =
                                         *(float *)(local_268.hit + 4);
                                    (((Vec3f *)((long)local_268.ray + 0x30))->field_0).field_0.z =
                                         *(float *)(local_268.hit + 8);
                                    *(float *)((long)local_268.ray + 0x3c) =
                                         *(float *)(local_268.hit + 0xc);
                                    *(float *)((long)local_268.ray + 0x40) =
                                         *(float *)(local_268.hit + 0x10);
                                    *(float *)((long)local_268.ray + 0x44) =
                                         *(float *)(local_268.hit + 0x14);
                                    *(float *)((long)local_268.ray + 0x48) =
                                         *(float *)(local_268.hit + 0x18);
                                    *(float *)((long)local_268.ray + 0x4c) =
                                         *(float *)(local_268.hit + 0x1c);
                                    *(float *)((long)local_268.ray + 0x50) =
                                         *(float *)(local_268.hit + 0x20);
                                  }
                                  else {
                                    local_278 = lVar37;
                                    (*pGVar8->intersectionFilterN)(&local_268);
                                    auVar249 = ZEXT3264(_DAT_01feed20);
                                    in_ZMM23 = ZEXT464(0x3e2aaaab);
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar247 = ZEXT1664(auVar42);
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                    auVar246 = ZEXT1664(auVar42);
                                    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar245 = ZEXT3264(auVar71);
                                    auVar88._16_16_ = auVar71._16_16_;
                                    auVar250 = ZEXT1664(local_328);
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar244 = ZEXT1664(auVar42);
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar253 = ZEXT1664(auVar42);
                                    auVar252 = ZEXT464(0x3f800000);
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar248 = ZEXT1664(auVar42);
                                    auVar42 = vxorps_avx512vl(auVar43,auVar43);
                                    auVar243 = ZEXT1664(auVar42);
                                    lVar37 = local_278;
                                    if (*local_268.valid != 0) goto LAB_01de240f;
LAB_01de252a:
                                    auVar252 = ZEXT464(0x3f800000);
                                    in_ZMM23 = ZEXT464(0x3e2aaaab);
                                    (ray->super_RayK<1>).tfar = fVar214;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar31 = lVar31 + -1;
                } while (lVar31 != 0);
              }
            }
          }
          auVar251 = ZEXT1664(local_1b8);
          if ((uint)uVar29 == 0) break;
        } while( true );
      }
      fVar215 = (ray->super_RayK<1>).tfar;
      auVar19._4_4_ = fVar215;
      auVar19._0_4_ = fVar215;
      auVar19._8_4_ = fVar215;
      auVar19._12_4_ = fVar215;
      auVar19._16_4_ = fVar215;
      auVar19._20_4_ = fVar215;
      auVar19._24_4_ = fVar215;
      auVar19._28_4_ = fVar215;
      uVar14 = vcmpps_avx512vl(local_98,auVar19,2);
      uVar35 = (uint)uVar36 & (uint)lVar37 & (uint)uVar14;
      uVar36 = (ulong)uVar35;
    } while (uVar35 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }